

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_h<embree::sse2::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  RTCRayQueryFlags *pRVar3;
  float *pfVar4;
  float *pfVar5;
  RTCRayQueryFlags *pRVar6;
  Primitive *pPVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  RTCFilterFunctionN p_Var22;
  long lVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined6 uVar41;
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  int iVar63;
  undefined4 uVar64;
  ulong uVar65;
  undefined4 uVar69;
  RayHit *extraout_RAX;
  undefined1 (*pauVar66) [16];
  long lVar67;
  RayHit *extraout_RAX_00;
  RayHit *pRVar68;
  RTCIntersectArguments *pRVar70;
  RTCIntersectArguments *pRVar71;
  int iVar72;
  ulong uVar73;
  long lVar74;
  ulong uVar75;
  long lVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar82;
  short sVar83;
  undefined2 uVar126;
  float fVar84;
  float fVar127;
  float fVar128;
  __m128 a_1;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float pp;
  float fVar129;
  float fVar155;
  float fVar156;
  undefined1 auVar130 [16];
  undefined1 auVar133 [16];
  undefined1 auVar136 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar157;
  float fVar166;
  float fVar167;
  vfloat4 v;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar168;
  float fVar187;
  float fVar188;
  vfloat4 v_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar189;
  float fVar198;
  float fVar199;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  float fVar200;
  float fVar228;
  float fVar229;
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [16];
  float fVar230;
  float fVar237;
  float fVar238;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar239;
  float fVar251;
  float fVar252;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar253;
  float fVar256;
  float fVar257;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar258;
  float fVar270;
  float fVar271;
  undefined1 auVar259 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar272;
  float fVar278;
  float fVar279;
  undefined1 auVar273 [16];
  undefined1 auVar276 [16];
  float fVar280;
  undefined1 auVar277 [16];
  float fVar281;
  float fVar290;
  float fVar292;
  vfloat4 a;
  float fVar294;
  undefined1 auVar283 [16];
  float fVar282;
  undefined1 auVar284 [16];
  undefined1 auVar287 [16];
  float fVar291;
  float fVar293;
  float fVar295;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar296;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar301 [16];
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar314;
  float fVar315;
  __m128 a_2;
  float fVar316;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  RTCFilterFunctionNArguments args;
  vfloat<4> Oz;
  vfloatx vu0;
  vfloat<4> A;
  vfloat<4> rl;
  BBox<embree::vfloat_impl<4>_> tp1;
  vfloat<4> dOz;
  vfloat<4> B;
  vfloat<4> dOdO;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined4 uStack_5c4;
  undefined4 uStack_5c0;
  undefined4 uStack_5bc;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  RTCFilterFunctionNArguments local_578;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  undefined4 local_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined8 local_4b8;
  float fStack_4b0;
  float fStack_4ac;
  undefined4 local_4a8;
  uint local_4a4;
  uint local_4a0;
  uint local_49c;
  uint local_498;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  RayQueryContext *local_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  Primitive *local_2e8;
  ulong local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  float local_1e8;
  float fStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 uVar125;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  
  PVar18 = prim[1];
  uVar65 = (ulong)(byte)PVar18;
  lVar76 = uVar65 * 0x25;
  pPVar7 = prim + lVar76 + 6;
  fVar167 = *(float *)(pPVar7 + 0xc);
  fVar168 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar7) * fVar167;
  fVar187 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar7 + 4)) * fVar167;
  fVar188 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar7 + 8)) * fVar167;
  fVar157 = fVar167 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar166 = fVar167 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar167 = fVar167 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar64 = *(undefined4 *)(prim + uVar65 * 4 + 6);
  uVar125 = (undefined1)((uint)uVar64 >> 0x18);
  uVar126 = CONCAT11(uVar125,uVar125);
  uVar125 = (undefined1)((uint)uVar64 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar126,uVar125),CONCAT14(uVar125,uVar64));
  uVar125 = (undefined1)((uint)uVar64 >> 8);
  uVar41 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar125),uVar125);
  sVar83 = CONCAT11((char)uVar64,(char)uVar64);
  uVar73 = CONCAT62(uVar41,sVar83);
  auVar263._8_4_ = 0;
  auVar263._0_8_ = uVar73;
  auVar263._12_2_ = uVar126;
  auVar263._14_2_ = uVar126;
  uVar126 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar85._12_4_ = auVar263._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar73;
  auVar85._10_2_ = uVar126;
  auVar159._10_6_ = auVar85._10_6_;
  auVar159._8_2_ = uVar126;
  auVar159._0_8_ = uVar73;
  uVar126 = (undefined2)uVar41;
  auVar42._4_8_ = auVar159._8_8_;
  auVar42._2_2_ = uVar126;
  auVar42._0_2_ = uVar126;
  fVar307 = (float)((int)sVar83 >> 8);
  fVar314 = (float)(auVar42._0_4_ >> 0x18);
  fVar315 = (float)(auVar159._8_4_ >> 0x18);
  uVar64 = *(undefined4 *)(prim + uVar65 * 5 + 6);
  uVar125 = (undefined1)((uint)uVar64 >> 0x18);
  uVar126 = CONCAT11(uVar125,uVar125);
  uVar125 = (undefined1)((uint)uVar64 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar126,uVar125),CONCAT14(uVar125,uVar64));
  uVar125 = (undefined1)((uint)uVar64 >> 8);
  uVar41 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar125),uVar125);
  sVar83 = CONCAT11((char)uVar64,(char)uVar64);
  uVar73 = CONCAT62(uVar41,sVar83);
  auVar132._8_4_ = 0;
  auVar132._0_8_ = uVar73;
  auVar132._12_2_ = uVar126;
  auVar132._14_2_ = uVar126;
  uVar126 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar131._12_4_ = auVar132._12_4_;
  auVar131._8_2_ = 0;
  auVar131._0_8_ = uVar73;
  auVar131._10_2_ = uVar126;
  auVar130._10_6_ = auVar131._10_6_;
  auVar130._8_2_ = uVar126;
  auVar130._0_8_ = uVar73;
  uVar126 = (undefined2)uVar41;
  auVar43._4_8_ = auVar130._8_8_;
  auVar43._2_2_ = uVar126;
  auVar43._0_2_ = uVar126;
  fVar189 = (float)((int)sVar83 >> 8);
  fVar198 = (float)(auVar43._0_4_ >> 0x18);
  fVar199 = (float)(auVar130._8_4_ >> 0x18);
  uVar64 = *(undefined4 *)(prim + uVar65 * 6 + 6);
  uVar125 = (undefined1)((uint)uVar64 >> 0x18);
  uVar126 = CONCAT11(uVar125,uVar125);
  uVar125 = (undefined1)((uint)uVar64 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar126,uVar125),CONCAT14(uVar125,uVar64));
  uVar125 = (undefined1)((uint)uVar64 >> 8);
  uVar41 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar125),uVar125);
  sVar83 = CONCAT11((char)uVar64,(char)uVar64);
  uVar73 = CONCAT62(uVar41,sVar83);
  auVar135._8_4_ = 0;
  auVar135._0_8_ = uVar73;
  auVar135._12_2_ = uVar126;
  auVar135._14_2_ = uVar126;
  uVar126 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar134._12_4_ = auVar135._12_4_;
  auVar134._8_2_ = 0;
  auVar134._0_8_ = uVar73;
  auVar134._10_2_ = uVar126;
  auVar133._10_6_ = auVar134._10_6_;
  auVar133._8_2_ = uVar126;
  auVar133._0_8_ = uVar73;
  uVar126 = (undefined2)uVar41;
  auVar44._4_8_ = auVar133._8_8_;
  auVar44._2_2_ = uVar126;
  auVar44._0_2_ = uVar126;
  fVar230 = (float)((int)sVar83 >> 8);
  fVar237 = (float)(auVar44._0_4_ >> 0x18);
  fVar238 = (float)(auVar133._8_4_ >> 0x18);
  uVar64 = *(undefined4 *)(prim + uVar65 * 0xf + 6);
  uVar125 = (undefined1)((uint)uVar64 >> 0x18);
  uVar126 = CONCAT11(uVar125,uVar125);
  uVar125 = (undefined1)((uint)uVar64 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar126,uVar125),CONCAT14(uVar125,uVar64));
  uVar125 = (undefined1)((uint)uVar64 >> 8);
  uVar41 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar125),uVar125);
  sVar83 = CONCAT11((char)uVar64,(char)uVar64);
  uVar73 = CONCAT62(uVar41,sVar83);
  auVar138._8_4_ = 0;
  auVar138._0_8_ = uVar73;
  auVar138._12_2_ = uVar126;
  auVar138._14_2_ = uVar126;
  uVar126 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar137._12_4_ = auVar138._12_4_;
  auVar137._8_2_ = 0;
  auVar137._0_8_ = uVar73;
  auVar137._10_2_ = uVar126;
  auVar136._10_6_ = auVar137._10_6_;
  auVar136._8_2_ = uVar126;
  auVar136._0_8_ = uVar73;
  uVar126 = (undefined2)uVar41;
  auVar45._4_8_ = auVar136._8_8_;
  auVar45._2_2_ = uVar126;
  auVar45._0_2_ = uVar126;
  fVar84 = (float)((int)sVar83 >> 8);
  fVar127 = (float)(auVar45._0_4_ >> 0x18);
  fVar128 = (float)(auVar136._8_4_ >> 0x18);
  uVar64 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar125 = (undefined1)((uint)uVar64 >> 0x18);
  uVar126 = CONCAT11(uVar125,uVar125);
  uVar125 = (undefined1)((uint)uVar64 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar126,uVar125),CONCAT14(uVar125,uVar64));
  uVar125 = (undefined1)((uint)uVar64 >> 8);
  uVar41 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar125),uVar125);
  sVar83 = CONCAT11((char)uVar64,(char)uVar64);
  uVar73 = CONCAT62(uVar41,sVar83);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar73;
  auVar203._12_2_ = uVar126;
  auVar203._14_2_ = uVar126;
  uVar126 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar73;
  auVar202._10_2_ = uVar126;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar126;
  auVar201._0_8_ = uVar73;
  uVar126 = (undefined2)uVar41;
  auVar46._4_8_ = auVar201._8_8_;
  auVar46._2_2_ = uVar126;
  auVar46._0_2_ = uVar126;
  fVar239 = (float)((int)sVar83 >> 8);
  fVar251 = (float)(auVar46._0_4_ >> 0x18);
  fVar252 = (float)(auVar201._8_4_ >> 0x18);
  uVar64 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar65 + 6);
  uVar125 = (undefined1)((uint)uVar64 >> 0x18);
  uVar126 = CONCAT11(uVar125,uVar125);
  uVar125 = (undefined1)((uint)uVar64 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar126,uVar125),CONCAT14(uVar125,uVar64));
  uVar125 = (undefined1)((uint)uVar64 >> 8);
  uVar41 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar125),uVar125);
  sVar83 = CONCAT11((char)uVar64,(char)uVar64);
  uVar73 = CONCAT62(uVar41,sVar83);
  auVar206._8_4_ = 0;
  auVar206._0_8_ = uVar73;
  auVar206._12_2_ = uVar126;
  auVar206._14_2_ = uVar126;
  uVar126 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar205._12_4_ = auVar206._12_4_;
  auVar205._8_2_ = 0;
  auVar205._0_8_ = uVar73;
  auVar205._10_2_ = uVar126;
  auVar204._10_6_ = auVar205._10_6_;
  auVar204._8_2_ = uVar126;
  auVar204._0_8_ = uVar73;
  uVar126 = (undefined2)uVar41;
  auVar47._4_8_ = auVar204._8_8_;
  auVar47._2_2_ = uVar126;
  auVar47._0_2_ = uVar126;
  fVar258 = (float)((int)sVar83 >> 8);
  fVar270 = (float)(auVar47._0_4_ >> 0x18);
  fVar271 = (float)(auVar204._8_4_ >> 0x18);
  uVar64 = *(undefined4 *)(prim + uVar65 * 0x1a + 6);
  uVar125 = (undefined1)((uint)uVar64 >> 0x18);
  uVar126 = CONCAT11(uVar125,uVar125);
  uVar125 = (undefined1)((uint)uVar64 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar126,uVar125),CONCAT14(uVar125,uVar64));
  uVar125 = (undefined1)((uint)uVar64 >> 8);
  uVar41 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar125),uVar125);
  sVar83 = CONCAT11((char)uVar64,(char)uVar64);
  uVar73 = CONCAT62(uVar41,sVar83);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar73;
  auVar209._12_2_ = uVar126;
  auVar209._14_2_ = uVar126;
  uVar126 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar73;
  auVar208._10_2_ = uVar126;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar126;
  auVar207._0_8_ = uVar73;
  uVar126 = (undefined2)uVar41;
  auVar48._4_8_ = auVar207._8_8_;
  auVar48._2_2_ = uVar126;
  auVar48._0_2_ = uVar126;
  fVar253 = (float)((int)sVar83 >> 8);
  fVar256 = (float)(auVar48._0_4_ >> 0x18);
  fVar257 = (float)(auVar207._8_4_ >> 0x18);
  uVar64 = *(undefined4 *)(prim + uVar65 * 0x1b + 6);
  uVar125 = (undefined1)((uint)uVar64 >> 0x18);
  uVar126 = CONCAT11(uVar125,uVar125);
  uVar125 = (undefined1)((uint)uVar64 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar126,uVar125),CONCAT14(uVar125,uVar64));
  uVar125 = (undefined1)((uint)uVar64 >> 8);
  uVar41 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar125),uVar125);
  sVar83 = CONCAT11((char)uVar64,(char)uVar64);
  uVar73 = CONCAT62(uVar41,sVar83);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar73;
  auVar212._12_2_ = uVar126;
  auVar212._14_2_ = uVar126;
  uVar126 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar73;
  auVar211._10_2_ = uVar126;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar126;
  auVar210._0_8_ = uVar73;
  uVar126 = (undefined2)uVar41;
  auVar49._4_8_ = auVar210._8_8_;
  auVar49._2_2_ = uVar126;
  auVar49._0_2_ = uVar126;
  fVar272 = (float)((int)sVar83 >> 8);
  fVar278 = (float)(auVar49._0_4_ >> 0x18);
  fVar279 = (float)(auVar210._8_4_ >> 0x18);
  uVar64 = *(undefined4 *)(prim + uVar65 * 0x1c + 6);
  uVar125 = (undefined1)((uint)uVar64 >> 0x18);
  uVar126 = CONCAT11(uVar125,uVar125);
  uVar125 = (undefined1)((uint)uVar64 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar126,uVar125),CONCAT14(uVar125,uVar64));
  uVar125 = (undefined1)((uint)uVar64 >> 8);
  uVar41 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar125),uVar125);
  sVar83 = CONCAT11((char)uVar64,(char)uVar64);
  uVar73 = CONCAT62(uVar41,sVar83);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar73;
  auVar215._12_2_ = uVar126;
  auVar215._14_2_ = uVar126;
  uVar126 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar73;
  auVar214._10_2_ = uVar126;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar126;
  auVar213._0_8_ = uVar73;
  uVar126 = (undefined2)uVar41;
  auVar50._4_8_ = auVar213._8_8_;
  auVar50._2_2_ = uVar126;
  auVar50._0_2_ = uVar126;
  fVar129 = (float)((int)sVar83 >> 8);
  fVar155 = (float)(auVar50._0_4_ >> 0x18);
  fVar156 = (float)(auVar213._8_4_ >> 0x18);
  fVar296 = fVar157 * fVar307 + fVar166 * fVar189 + fVar167 * fVar230;
  fVar302 = fVar157 * fVar314 + fVar166 * fVar198 + fVar167 * fVar237;
  fVar303 = fVar157 * fVar315 + fVar166 * fVar199 + fVar167 * fVar238;
  fVar305 = fVar157 * (float)(auVar85._12_4_ >> 0x18) +
            fVar166 * (float)(auVar131._12_4_ >> 0x18) + fVar167 * (float)(auVar134._12_4_ >> 0x18);
  fVar281 = fVar157 * fVar84 + fVar166 * fVar239 + fVar167 * fVar258;
  fVar290 = fVar157 * fVar127 + fVar166 * fVar251 + fVar167 * fVar270;
  fVar292 = fVar157 * fVar128 + fVar166 * fVar252 + fVar167 * fVar271;
  fVar294 = fVar157 * (float)(auVar137._12_4_ >> 0x18) +
            fVar166 * (float)(auVar202._12_4_ >> 0x18) + fVar167 * (float)(auVar205._12_4_ >> 0x18);
  fVar200 = fVar157 * fVar253 + fVar166 * fVar272 + fVar167 * fVar129;
  fVar228 = fVar157 * fVar256 + fVar166 * fVar278 + fVar167 * fVar155;
  fVar229 = fVar157 * fVar257 + fVar166 * fVar279 + fVar167 * fVar156;
  fVar157 = fVar157 * (float)(auVar208._12_4_ >> 0x18) +
            fVar166 * (float)(auVar211._12_4_ >> 0x18) + fVar167 * (float)(auVar214._12_4_ >> 0x18);
  fVar308 = fVar307 * fVar168 + fVar189 * fVar187 + fVar230 * fVar188;
  fVar314 = fVar314 * fVar168 + fVar198 * fVar187 + fVar237 * fVar188;
  fVar315 = fVar315 * fVar168 + fVar199 * fVar187 + fVar238 * fVar188;
  fVar316 = (float)(auVar85._12_4_ >> 0x18) * fVar168 +
            (float)(auVar131._12_4_ >> 0x18) * fVar187 + (float)(auVar134._12_4_ >> 0x18) * fVar188;
  fVar258 = fVar84 * fVar168 + fVar239 * fVar187 + fVar258 * fVar188;
  fVar270 = fVar127 * fVar168 + fVar251 * fVar187 + fVar270 * fVar188;
  fVar271 = fVar128 * fVar168 + fVar252 * fVar187 + fVar271 * fVar188;
  fVar307 = (float)(auVar137._12_4_ >> 0x18) * fVar168 +
            (float)(auVar202._12_4_ >> 0x18) * fVar187 + (float)(auVar205._12_4_ >> 0x18) * fVar188;
  fVar253 = fVar168 * fVar253 + fVar187 * fVar272 + fVar188 * fVar129;
  fVar256 = fVar168 * fVar256 + fVar187 * fVar278 + fVar188 * fVar155;
  fVar257 = fVar168 * fVar257 + fVar187 * fVar279 + fVar188 * fVar156;
  fVar272 = fVar168 * (float)(auVar208._12_4_ >> 0x18) +
            fVar187 * (float)(auVar211._12_4_ >> 0x18) + fVar188 * (float)(auVar214._12_4_ >> 0x18);
  fVar167 = (float)DAT_01f80d30;
  fVar84 = DAT_01f80d30._4_4_;
  fVar127 = DAT_01f80d30._8_4_;
  fVar128 = DAT_01f80d30._12_4_;
  uVar77 = -(uint)(fVar167 <= ABS(fVar296));
  uVar78 = -(uint)(fVar84 <= ABS(fVar302));
  uVar79 = -(uint)(fVar127 <= ABS(fVar303));
  uVar81 = -(uint)(fVar128 <= ABS(fVar305));
  auVar297._0_4_ = (uint)fVar296 & uVar77;
  auVar297._4_4_ = (uint)fVar302 & uVar78;
  auVar297._8_4_ = (uint)fVar303 & uVar79;
  auVar297._12_4_ = (uint)fVar305 & uVar81;
  auVar169._0_4_ = ~uVar77 & (uint)fVar167;
  auVar169._4_4_ = ~uVar78 & (uint)fVar84;
  auVar169._8_4_ = ~uVar79 & (uint)fVar127;
  auVar169._12_4_ = ~uVar81 & (uint)fVar128;
  auVar169 = auVar169 | auVar297;
  uVar77 = -(uint)(fVar167 <= ABS(fVar281));
  uVar78 = -(uint)(fVar84 <= ABS(fVar290));
  uVar79 = -(uint)(fVar127 <= ABS(fVar292));
  uVar81 = -(uint)(fVar128 <= ABS(fVar294));
  auVar283._0_4_ = (uint)fVar281 & uVar77;
  auVar283._4_4_ = (uint)fVar290 & uVar78;
  auVar283._8_4_ = (uint)fVar292 & uVar79;
  auVar283._12_4_ = (uint)fVar294 & uVar81;
  auVar231._0_4_ = ~uVar77 & (uint)fVar167;
  auVar231._4_4_ = ~uVar78 & (uint)fVar84;
  auVar231._8_4_ = ~uVar79 & (uint)fVar127;
  auVar231._12_4_ = ~uVar81 & (uint)fVar128;
  auVar231 = auVar231 | auVar283;
  uVar77 = -(uint)(fVar167 <= ABS(fVar200));
  uVar78 = -(uint)(fVar84 <= ABS(fVar228));
  uVar79 = -(uint)(fVar127 <= ABS(fVar229));
  uVar81 = -(uint)(fVar128 <= ABS(fVar157));
  auVar216._0_4_ = (uint)fVar200 & uVar77;
  auVar216._4_4_ = (uint)fVar228 & uVar78;
  auVar216._8_4_ = (uint)fVar229 & uVar79;
  auVar216._12_4_ = (uint)fVar157 & uVar81;
  auVar240._0_4_ = ~uVar77 & (uint)fVar167;
  auVar240._4_4_ = ~uVar78 & (uint)fVar84;
  auVar240._8_4_ = ~uVar79 & (uint)fVar127;
  auVar240._12_4_ = ~uVar81 & (uint)fVar128;
  auVar240 = auVar240 | auVar216;
  auVar85 = rcpps(_DAT_01f80d30,auVar169);
  fVar167 = auVar85._0_4_;
  fVar128 = auVar85._4_4_;
  fVar189 = auVar85._8_4_;
  fVar239 = auVar85._12_4_;
  fVar167 = (1.0 - auVar169._0_4_ * fVar167) * fVar167 + fVar167;
  fVar128 = (1.0 - auVar169._4_4_ * fVar128) * fVar128 + fVar128;
  fVar189 = (1.0 - auVar169._8_4_ * fVar189) * fVar189 + fVar189;
  fVar239 = (1.0 - auVar169._12_4_ * fVar239) * fVar239 + fVar239;
  auVar85 = rcpps(auVar85,auVar231);
  fVar84 = auVar85._0_4_;
  fVar129 = auVar85._4_4_;
  fVar198 = auVar85._8_4_;
  fVar251 = auVar85._12_4_;
  fVar84 = (1.0 - auVar231._0_4_ * fVar84) * fVar84 + fVar84;
  fVar129 = (1.0 - auVar231._4_4_ * fVar129) * fVar129 + fVar129;
  fVar198 = (1.0 - auVar231._8_4_ * fVar198) * fVar198 + fVar198;
  fVar251 = (1.0 - auVar231._12_4_ * fVar251) * fVar251 + fVar251;
  auVar85 = rcpps(auVar85,auVar240);
  fVar127 = auVar85._0_4_;
  fVar155 = auVar85._4_4_;
  fVar199 = auVar85._8_4_;
  fVar252 = auVar85._12_4_;
  fVar127 = (1.0 - auVar240._0_4_ * fVar127) * fVar127 + fVar127;
  fVar155 = (1.0 - auVar240._4_4_ * fVar155) * fVar155 + fVar155;
  fVar199 = (1.0 - auVar240._8_4_ * fVar199) * fVar199 + fVar199;
  fVar252 = (1.0 - auVar240._12_4_ * fVar252) * fVar252 + fVar252;
  fVar278 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar76 + 0x16)) *
            *(float *)(prim + lVar76 + 0x1a);
  uVar73 = *(ulong *)(prim + uVar65 * 7 + 6);
  uVar126 = (undefined2)(uVar73 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar73;
  auVar87._12_2_ = uVar126;
  auVar87._14_2_ = uVar126;
  uVar126 = (undefined2)(uVar73 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar73;
  auVar86._10_2_ = uVar126;
  auVar289._10_6_ = auVar86._10_6_;
  auVar289._8_2_ = uVar126;
  auVar289._0_8_ = uVar73;
  uVar126 = (undefined2)(uVar73 >> 0x10);
  auVar51._4_8_ = auVar289._8_8_;
  auVar51._2_2_ = uVar126;
  auVar51._0_2_ = uVar126;
  fVar156 = (float)(auVar51._0_4_ >> 0x10);
  fVar200 = (float)(auVar289._8_4_ >> 0x10);
  uVar8 = *(ulong *)(prim + uVar65 * 0xb + 6);
  uVar126 = (undefined2)(uVar8 >> 0x30);
  auVar172._8_4_ = 0;
  auVar172._0_8_ = uVar8;
  auVar172._12_2_ = uVar126;
  auVar172._14_2_ = uVar126;
  uVar126 = (undefined2)(uVar8 >> 0x20);
  auVar171._12_4_ = auVar172._12_4_;
  auVar171._8_2_ = 0;
  auVar171._0_8_ = uVar8;
  auVar171._10_2_ = uVar126;
  auVar170._10_6_ = auVar171._10_6_;
  auVar170._8_2_ = uVar126;
  auVar170._0_8_ = uVar8;
  uVar126 = (undefined2)(uVar8 >> 0x10);
  auVar52._4_8_ = auVar170._8_8_;
  auVar52._2_2_ = uVar126;
  auVar52._0_2_ = uVar126;
  uVar9 = *(ulong *)(prim + uVar65 * 9 + 6);
  uVar126 = (undefined2)(uVar9 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar9;
  auVar90._12_2_ = uVar126;
  auVar90._14_2_ = uVar126;
  uVar126 = (undefined2)(uVar9 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar9;
  auVar89._10_2_ = uVar126;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar126;
  auVar88._0_8_ = uVar9;
  uVar126 = (undefined2)(uVar9 >> 0x10);
  auVar53._4_8_ = auVar88._8_8_;
  auVar53._2_2_ = uVar126;
  auVar53._0_2_ = uVar126;
  fVar157 = (float)(auVar53._0_4_ >> 0x10);
  fVar228 = (float)(auVar88._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar65 * 0xd + 6);
  uVar126 = (undefined2)(uVar10 >> 0x30);
  auVar243._8_4_ = 0;
  auVar243._0_8_ = uVar10;
  auVar243._12_2_ = uVar126;
  auVar243._14_2_ = uVar126;
  uVar126 = (undefined2)(uVar10 >> 0x20);
  auVar242._12_4_ = auVar243._12_4_;
  auVar242._8_2_ = 0;
  auVar242._0_8_ = uVar10;
  auVar242._10_2_ = uVar126;
  auVar241._10_6_ = auVar242._10_6_;
  auVar241._8_2_ = uVar126;
  auVar241._0_8_ = uVar10;
  uVar126 = (undefined2)(uVar10 >> 0x10);
  auVar54._4_8_ = auVar241._8_8_;
  auVar54._2_2_ = uVar126;
  auVar54._0_2_ = uVar126;
  uVar11 = *(ulong *)(prim + uVar65 * 0x12 + 6);
  uVar126 = (undefined2)(uVar11 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar11;
  auVar93._12_2_ = uVar126;
  auVar93._14_2_ = uVar126;
  uVar126 = (undefined2)(uVar11 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar11;
  auVar92._10_2_ = uVar126;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar126;
  auVar91._0_8_ = uVar11;
  uVar126 = (undefined2)(uVar11 >> 0x10);
  auVar55._4_8_ = auVar91._8_8_;
  auVar55._2_2_ = uVar126;
  auVar55._0_2_ = uVar126;
  fVar166 = (float)(auVar55._0_4_ >> 0x10);
  fVar229 = (float)(auVar91._8_4_ >> 0x10);
  uVar75 = (ulong)(uint)((int)(uVar65 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar65 * 2 + uVar75 + 6);
  uVar126 = (undefined2)(uVar12 >> 0x30);
  auVar261._8_4_ = 0;
  auVar261._0_8_ = uVar12;
  auVar261._12_2_ = uVar126;
  auVar261._14_2_ = uVar126;
  uVar126 = (undefined2)(uVar12 >> 0x20);
  auVar260._12_4_ = auVar261._12_4_;
  auVar260._8_2_ = 0;
  auVar260._0_8_ = uVar12;
  auVar260._10_2_ = uVar126;
  auVar259._10_6_ = auVar260._10_6_;
  auVar259._8_2_ = uVar126;
  auVar259._0_8_ = uVar12;
  uVar126 = (undefined2)(uVar12 >> 0x10);
  auVar56._4_8_ = auVar259._8_8_;
  auVar56._2_2_ = uVar126;
  auVar56._0_2_ = uVar126;
  uVar75 = *(ulong *)(prim + uVar75 + 6);
  uVar126 = (undefined2)(uVar75 >> 0x30);
  auVar96._8_4_ = 0;
  auVar96._0_8_ = uVar75;
  auVar96._12_2_ = uVar126;
  auVar96._14_2_ = uVar126;
  uVar126 = (undefined2)(uVar75 >> 0x20);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._8_2_ = 0;
  auVar95._0_8_ = uVar75;
  auVar95._10_2_ = uVar126;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._8_2_ = uVar126;
  auVar94._0_8_ = uVar75;
  uVar126 = (undefined2)(uVar75 >> 0x10);
  auVar57._4_8_ = auVar94._8_8_;
  auVar57._2_2_ = uVar126;
  auVar57._0_2_ = uVar126;
  fVar168 = (float)(auVar57._0_4_ >> 0x10);
  fVar230 = (float)(auVar94._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar65 * 0x18 + 6);
  uVar126 = (undefined2)(uVar13 >> 0x30);
  auVar275._8_4_ = 0;
  auVar275._0_8_ = uVar13;
  auVar275._12_2_ = uVar126;
  auVar275._14_2_ = uVar126;
  uVar126 = (undefined2)(uVar13 >> 0x20);
  auVar274._12_4_ = auVar275._12_4_;
  auVar274._8_2_ = 0;
  auVar274._0_8_ = uVar13;
  auVar274._10_2_ = uVar126;
  auVar273._10_6_ = auVar274._10_6_;
  auVar273._8_2_ = uVar126;
  auVar273._0_8_ = uVar13;
  uVar126 = (undefined2)(uVar13 >> 0x10);
  auVar58._4_8_ = auVar273._8_8_;
  auVar58._2_2_ = uVar126;
  auVar58._0_2_ = uVar126;
  uVar14 = *(ulong *)(prim + uVar65 * 0x1d + 6);
  uVar126 = (undefined2)(uVar14 >> 0x30);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar14;
  auVar99._12_2_ = uVar126;
  auVar99._14_2_ = uVar126;
  uVar126 = (undefined2)(uVar14 >> 0x20);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar14;
  auVar98._10_2_ = uVar126;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = uVar126;
  auVar97._0_8_ = uVar14;
  uVar126 = (undefined2)(uVar14 >> 0x10);
  auVar59._4_8_ = auVar97._8_8_;
  auVar59._2_2_ = uVar126;
  auVar59._0_2_ = uVar126;
  fVar187 = (float)(auVar59._0_4_ >> 0x10);
  fVar237 = (float)(auVar97._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar65 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar126 = (undefined2)(uVar15 >> 0x30);
  auVar286._8_4_ = 0;
  auVar286._0_8_ = uVar15;
  auVar286._12_2_ = uVar126;
  auVar286._14_2_ = uVar126;
  uVar126 = (undefined2)(uVar15 >> 0x20);
  auVar285._12_4_ = auVar286._12_4_;
  auVar285._8_2_ = 0;
  auVar285._0_8_ = uVar15;
  auVar285._10_2_ = uVar126;
  auVar284._10_6_ = auVar285._10_6_;
  auVar284._8_2_ = uVar126;
  auVar284._0_8_ = uVar15;
  uVar126 = (undefined2)(uVar15 >> 0x10);
  auVar60._4_8_ = auVar284._8_8_;
  auVar60._2_2_ = uVar126;
  auVar60._0_2_ = uVar126;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar65) + 6);
  uVar126 = (undefined2)(uVar16 >> 0x30);
  auVar102._8_4_ = 0;
  auVar102._0_8_ = uVar16;
  auVar102._12_2_ = uVar126;
  auVar102._14_2_ = uVar126;
  uVar126 = (undefined2)(uVar16 >> 0x20);
  auVar101._12_4_ = auVar102._12_4_;
  auVar101._8_2_ = 0;
  auVar101._0_8_ = uVar16;
  auVar101._10_2_ = uVar126;
  auVar100._10_6_ = auVar101._10_6_;
  auVar100._8_2_ = uVar126;
  auVar100._0_8_ = uVar16;
  uVar126 = (undefined2)(uVar16 >> 0x10);
  auVar61._4_8_ = auVar100._8_8_;
  auVar61._2_2_ = uVar126;
  auVar61._0_2_ = uVar126;
  fVar188 = (float)(auVar61._0_4_ >> 0x10);
  fVar238 = (float)(auVar100._8_4_ >> 0x10);
  uVar65 = *(ulong *)(prim + uVar65 * 0x23 + 6);
  uVar126 = (undefined2)(uVar65 >> 0x30);
  auVar300._8_4_ = 0;
  auVar300._0_8_ = uVar65;
  auVar300._12_2_ = uVar126;
  auVar300._14_2_ = uVar126;
  uVar126 = (undefined2)(uVar65 >> 0x20);
  auVar299._12_4_ = auVar300._12_4_;
  auVar299._8_2_ = 0;
  auVar299._0_8_ = uVar65;
  auVar299._10_2_ = uVar126;
  auVar298._10_6_ = auVar299._10_6_;
  auVar298._8_2_ = uVar126;
  auVar298._0_8_ = uVar65;
  uVar126 = (undefined2)(uVar65 >> 0x10);
  auVar62._4_8_ = auVar298._8_8_;
  auVar62._2_2_ = uVar126;
  auVar62._0_2_ = uVar126;
  auVar173._0_8_ =
       CONCAT44(((((float)(auVar52._0_4_ >> 0x10) - fVar156) * fVar278 + fVar156) - fVar314) *
                fVar128,((((float)(int)(short)uVar8 - (float)(int)(short)uVar73) * fVar278 +
                         (float)(int)(short)uVar73) - fVar308) * fVar167);
  auVar173._8_4_ =
       ((((float)(auVar170._8_4_ >> 0x10) - fVar200) * fVar278 + fVar200) - fVar315) * fVar189;
  auVar173._12_4_ =
       ((((float)(auVar171._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar316) * fVar239;
  auVar244._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar278 + (float)(int)(short)uVar9
        ) - fVar308) * fVar167;
  auVar244._4_4_ =
       ((((float)(auVar54._0_4_ >> 0x10) - fVar157) * fVar278 + fVar157) - fVar314) * fVar128;
  auVar244._8_4_ =
       ((((float)(auVar241._8_4_ >> 0x10) - fVar228) * fVar278 + fVar228) - fVar315) * fVar189;
  auVar244._12_4_ =
       ((((float)(auVar242._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar316) * fVar239;
  auVar262._0_8_ =
       CONCAT44(((((float)(auVar56._0_4_ >> 0x10) - fVar166) * fVar278 + fVar166) - fVar270) *
                fVar129,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar278 +
                         (float)(int)(short)uVar11) - fVar258) * fVar84);
  auVar262._8_4_ =
       ((((float)(auVar259._8_4_ >> 0x10) - fVar229) * fVar278 + fVar229) - fVar271) * fVar198;
  auVar262._12_4_ =
       ((((float)(auVar260._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar307) * fVar251;
  auVar276._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar75) * fVar278 +
        (float)(int)(short)uVar75) - fVar258) * fVar84;
  auVar276._4_4_ =
       ((((float)(auVar58._0_4_ >> 0x10) - fVar168) * fVar278 + fVar168) - fVar270) * fVar129;
  auVar276._8_4_ =
       ((((float)(auVar273._8_4_ >> 0x10) - fVar230) * fVar278 + fVar230) - fVar271) * fVar198;
  auVar276._12_4_ =
       ((((float)(auVar274._12_4_ >> 0x10) - (float)(auVar95._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar95._12_4_ >> 0x10)) - fVar307) * fVar251;
  auVar287._0_8_ =
       CONCAT44(((((float)(auVar60._0_4_ >> 0x10) - fVar187) * fVar278 + fVar187) - fVar256) *
                fVar155,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar278 +
                         (float)(int)(short)uVar14) - fVar253) * fVar127);
  auVar287._8_4_ =
       ((((float)(auVar284._8_4_ >> 0x10) - fVar237) * fVar278 + fVar237) - fVar257) * fVar199;
  auVar287._12_4_ =
       ((((float)(auVar285._12_4_ >> 0x10) - (float)(auVar98._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar98._12_4_ >> 0x10)) - fVar272) * fVar252;
  auVar301._0_4_ =
       ((((float)(int)(short)uVar65 - (float)(int)(short)uVar16) * fVar278 +
        (float)(int)(short)uVar16) - fVar253) * fVar127;
  auVar301._4_4_ =
       ((((float)(auVar62._0_4_ >> 0x10) - fVar188) * fVar278 + fVar188) - fVar256) * fVar155;
  auVar301._8_4_ =
       ((((float)(auVar298._8_4_ >> 0x10) - fVar238) * fVar278 + fVar238) - fVar257) * fVar199;
  auVar301._12_4_ =
       ((((float)(auVar299._12_4_ >> 0x10) - (float)(auVar101._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar101._12_4_ >> 0x10)) - fVar272) * fVar252;
  auVar158._8_4_ = auVar173._8_4_;
  auVar158._0_8_ = auVar173._0_8_;
  auVar158._12_4_ = auVar173._12_4_;
  auVar159 = minps(auVar158,auVar244);
  auVar103._8_4_ = auVar262._8_4_;
  auVar103._0_8_ = auVar262._0_8_;
  auVar103._12_4_ = auVar262._12_4_;
  auVar85 = minps(auVar103,auVar276);
  auVar159 = maxps(auVar159,auVar85);
  auVar104._8_4_ = auVar287._8_4_;
  auVar104._0_8_ = auVar287._0_8_;
  auVar104._12_4_ = auVar287._12_4_;
  auVar85 = minps(auVar104,auVar301);
  uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar139._4_4_ = uVar64;
  auVar139._0_4_ = uVar64;
  auVar139._8_4_ = uVar64;
  auVar139._12_4_ = uVar64;
  auVar85 = maxps(auVar85,auVar139);
  auVar85 = maxps(auVar159,auVar85);
  auVar159 = maxps(auVar173,auVar244);
  auVar263 = maxps(auVar262,auVar276);
  auVar159 = minps(auVar159,auVar263);
  local_278 = auVar85._0_4_ * 0.99999964;
  fStack_274 = auVar85._4_4_ * 0.99999964;
  fStack_270 = auVar85._8_4_ * 0.99999964;
  fStack_26c = auVar85._12_4_ * 0.99999964;
  auVar85 = maxps(auVar287,auVar301);
  fVar167 = (ray->super_RayK<1>).tfar;
  auVar105._4_4_ = fVar167;
  auVar105._0_4_ = fVar167;
  auVar105._8_4_ = fVar167;
  auVar105._12_4_ = fVar167;
  auVar85 = minps(auVar85,auVar105);
  auVar85 = minps(auVar159,auVar85);
  uVar77 = (uint)(byte)PVar18;
  auVar140._0_4_ = -(uint)(uVar77 != 0 && local_278 <= auVar85._0_4_ * 1.0000004);
  auVar140._4_4_ = -(uint)(1 < uVar77 && fStack_274 <= auVar85._4_4_ * 1.0000004);
  auVar140._8_4_ = -(uint)(2 < uVar77 && fStack_270 <= auVar85._8_4_ * 1.0000004);
  auVar140._12_4_ = -(uint)(3 < uVar77 && fStack_26c <= auVar85._12_4_ * 1.0000004);
  uVar77 = movmskps(uVar77,auVar140);
  if (uVar77 == 0) {
    return;
  }
  uVar77 = uVar77 & 0xff;
  local_1f8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1f8._12_4_ = 0;
  local_380 = context;
  local_2e8 = prim;
LAB_00b18091:
  local_2e0 = (ulong)uVar77;
  lVar76 = 0;
  if (local_2e0 != 0) {
    for (; (uVar77 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
    }
  }
  uVar77 = *(uint *)(local_2e8 + 2);
  pRVar71 = (RTCIntersectArguments *)(ulong)uVar77;
  uVar78 = *(uint *)(local_2e8 + lVar76 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[(long)pRVar71].ptr;
  uVar73 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           (ulong)uVar78 *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  local_4c8 = pGVar19->fnumTimeSegments;
  fVar167 = (pGVar19->time_range).lower;
  fVar84 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar167) /
           ((pGVar19->time_range).upper - fVar167)) * local_4c8;
  fVar167 = floorf(fVar84);
  if (local_4c8 + -1.0 <= fVar167) {
    fVar167 = local_4c8 + -1.0;
  }
  fVar127 = 0.0;
  if (0.0 <= fVar167) {
    fVar127 = fVar167;
  }
  fVar84 = fVar84 - fVar127;
  fVar156 = 1.0 - fVar84;
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar74 = (long)(int)fVar127 * 0x38;
  lVar67 = *(long *)(_Var20 + lVar74);
  lVar21 = *(long *)(_Var20 + 0x10 + lVar74);
  lVar76 = uVar73 + 1;
  p_Var22 = pGVar19[4].occlusionFilterN;
  pRVar70 = *(RTCIntersectArguments **)(p_Var22 + lVar74);
  lVar23 = *(long *)(_Var20 + 0x38 + lVar74);
  lVar24 = *(long *)(_Var20 + 0x48 + lVar74);
  pfVar1 = (float *)(lVar23 + lVar24 * uVar73);
  pfVar2 = (float *)(lVar67 + lVar21 * uVar73);
  local_588._0_4_ = *pfVar2 * fVar156 + *pfVar1 * fVar84;
  local_588._4_4_ = pfVar2[1] * fVar156 + pfVar1[1] * fVar84;
  fStack_580 = pfVar2[2] * fVar156 + pfVar1[2] * fVar84;
  fVar166 = pfVar2[3] * fVar156 + pfVar1[3] * fVar84;
  pfVar1 = (float *)(*(long *)(p_Var22 + lVar74 + 0x38) +
                    uVar73 * *(long *)(p_Var22 + lVar74 + 0x48));
  pRVar3 = (RTCRayQueryFlags *)((long)&pRVar70->flags + *(long *)(p_Var22 + lVar74 + 0x10) * uVar73)
  ;
  pfVar2 = (float *)(lVar23 + lVar24 * lVar76);
  pfVar4 = (float *)(lVar67 + lVar21 * lVar76);
  pfVar5 = (float *)(*(long *)(p_Var22 + lVar74 + 0x38) +
                    *(long *)(p_Var22 + lVar74 + 0x48) * lVar76);
  pRVar6 = (RTCRayQueryFlags *)((long)&pRVar70->flags + *(long *)(p_Var22 + lVar74 + 0x10) * lVar76)
  ;
  fVar168 = *pfVar4 * fVar156 + *pfVar2 * fVar84;
  fVar187 = pfVar4[1] * fVar156 + pfVar2[1] * fVar84;
  fVar188 = pfVar4[2] * fVar156 + pfVar2[2] * fVar84;
  fVar189 = pfVar4[3] * fVar156 + pfVar2[3] * fVar84;
  fVar155 = ((float)*pRVar3 * fVar156 + *pfVar1 * fVar84) * 0.33333334 + (float)local_588._0_4_;
  fStack_4c4 = ((float)pRVar3[1] * fVar156 + pfVar1[1] * fVar84) * 0.33333334 +
               (float)local_588._4_4_;
  fStack_4c0 = ((float)pRVar3[2] * fVar156 + pfVar1[2] * fVar84) * 0.33333334 + fStack_580;
  fVar198 = fVar168 - (fVar156 * (float)*pRVar6 + fVar84 * *pfVar5) * 0.33333334;
  local_178 = fVar187 - (fVar156 * (float)pRVar6[1] + fVar84 * pfVar5[1]) * 0.33333334;
  local_188 = fVar188 - (fVar156 * (float)pRVar6[2] + fVar84 * pfVar5[2]) * 0.33333334;
  fVar167 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar127 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar128 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_318 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_478 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_548 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar129 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_13c = local_318 * local_318;
  fVar199 = local_478 * local_478;
  fVar200 = local_548 * local_548;
  fVar129 = fVar129 * fVar129;
  fVar157 = fStack_13c + fVar199 + fVar200;
  auVar190._0_8_ = CONCAT44(fVar199 + fVar199 + fVar129,fVar157);
  auVar190._8_4_ = fVar200 + fVar199 + fVar200;
  auVar190._12_4_ = fVar129 + fVar199 + fVar129;
  auVar174._8_4_ = auVar190._8_4_;
  auVar174._0_8_ = auVar190._0_8_;
  auVar174._12_4_ = auVar190._12_4_;
  auVar85 = rcpss(auVar174,auVar190);
  local_4f8 = (2.0 - fVar157 * auVar85._0_4_) * auVar85._0_4_ *
              (((fStack_580 + fStack_4c0 + local_188 + fVar188) * 0.25 - fVar128) * local_548 +
              (((float)local_588._4_4_ + fStack_4c4 + local_178 + fVar187) * 0.25 - fVar127) *
              local_478 +
              (((float)local_588._0_4_ + fVar155 + fVar198 + fVar168) * 0.25 - fVar167) * local_318)
  ;
  local_308 = ZEXT416((uint)local_4f8);
  fVar167 = local_318 * local_4f8 + fVar167;
  fVar127 = local_478 * local_4f8 + fVar127;
  fVar128 = local_548 * local_4f8 + fVar128;
  local_588._0_4_ = (float)local_588._0_4_ - fVar167;
  local_588._4_4_ = (float)local_588._4_4_ - fVar127;
  fStack_580 = fStack_580 - fVar128;
  fStack_57c = fVar166 - 0.0;
  fVar198 = fVar198 - fVar167;
  local_178 = local_178 - fVar127;
  local_188 = local_188 - fVar128;
  fStack_34c = (fVar189 - (fVar156 * (float)pRVar6[3] + fVar84 * pfVar5[3]) * 0.33333334) - 0.0;
  fVar155 = fVar155 - fVar167;
  fStack_4c4 = fStack_4c4 - fVar127;
  fStack_4c0 = fStack_4c0 - fVar128;
  fVar84 = (((float)pRVar3[3] * fVar156 + pfVar1[3] * fVar84) * 0.33333334 + fVar166) - 0.0;
  fVar168 = fVar168 - fVar167;
  fVar187 = fVar187 - fVar127;
  fVar188 = fVar188 - fVar128;
  fVar189 = fVar189 - 0.0;
  local_158 = fStack_57c;
  fStack_154 = fStack_57c;
  fStack_150 = fStack_57c;
  fStack_14c = fStack_57c;
  local_168 = fStack_4c4;
  fStack_164 = fStack_4c4;
  fStack_160 = fStack_4c4;
  fStack_15c = fStack_4c4;
  local_148 = fStack_13c + fVar200 + fVar199;
  fStack_144 = fStack_13c + fVar200 + fVar199;
  fStack_140 = fStack_13c + fVar200 + fVar199;
  fStack_13c = fStack_13c + fVar200 + fVar199;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_184 = local_188;
  fStack_180 = local_188;
  fStack_17c = local_188;
  local_358 = fVar198;
  fStack_354 = local_178;
  fStack_350 = local_188;
  local_2a8 = fStack_34c;
  fStack_2a4 = fStack_34c;
  fStack_2a0 = fStack_34c;
  fStack_29c = fStack_34c;
  local_198 = fVar168;
  fStack_194 = fVar168;
  fStack_190 = fVar168;
  fStack_18c = fVar168;
  local_1a8 = fVar187;
  fStack_1a4 = fVar187;
  fStack_1a0 = fVar187;
  fStack_19c = fVar187;
  local_1b8 = fVar188;
  fStack_1b4 = fVar188;
  fStack_1b0 = fVar188;
  fStack_1ac = fVar188;
  local_1c8 = fVar189;
  fStack_1c4 = fVar189;
  fStack_1c0 = fVar189;
  fStack_1bc = fVar189;
  fStack_314 = local_318;
  fStack_310 = local_318;
  fStack_30c = local_318;
  fStack_474 = local_478;
  fStack_470 = local_478;
  fStack_46c = local_478;
  local_2b8 = ABS(local_148);
  fStack_2b4 = ABS(fStack_144);
  fStack_2b0 = ABS(fStack_140);
  fStack_2ac = ABS(fStack_13c);
  fVar167 = 1.4013e-45;
  uVar73 = 0;
  local_1e8 = 0.0;
  fStack_1e4 = 1.0;
  local_218 = (float)local_588._0_4_;
  fStack_214 = (float)local_588._0_4_;
  fStack_210 = (float)local_588._0_4_;
  fStack_20c = (float)local_588._0_4_;
  local_228 = (float)local_588._4_4_;
  fStack_224 = (float)local_588._4_4_;
  fStack_220 = (float)local_588._4_4_;
  fStack_21c = (float)local_588._4_4_;
  local_238 = fStack_580;
  fStack_234 = fStack_580;
  fStack_230 = fStack_580;
  fStack_22c = fStack_580;
  local_368 = fVar155;
  fStack_364 = fVar155;
  fStack_360 = fVar155;
  fStack_35c = fVar155;
  local_248 = fStack_4c0;
  fStack_244 = fStack_4c0;
  fStack_240 = fStack_4c0;
  fStack_23c = fStack_4c0;
  local_378 = fVar84;
  fStack_374 = fVar84;
  fStack_370 = fVar84;
  fStack_36c = fVar84;
  fVar156 = fVar155;
  fVar157 = fVar155;
  fVar166 = fVar155;
  fVar127 = fVar84;
  fVar128 = fVar84;
  fVar129 = fVar84;
  fStack_544 = local_548;
  fStack_540 = local_548;
  fStack_53c = local_548;
  fStack_4f4 = local_4f8;
  fStack_4f0 = local_4f8;
  fStack_4ec = local_4f8;
  local_4c8 = fVar155;
  fStack_4bc = fVar84;
  do {
    context = local_380;
    uVar64 = SUB84(pRVar70,0);
    iVar72 = (int)uVar73;
    local_448 = fStack_1e4 - local_1e8;
    uStack_1e0 = 0;
    uStack_1dc = 0;
    fStack_444 = local_448;
    fStack_440 = local_448;
    fStack_43c = local_448;
    local_468 = local_1e8;
    fStack_464 = local_1e8;
    fStack_460 = local_1e8;
    fStack_45c = local_1e8;
    fVar199 = local_448 * 0.0 + local_1e8;
    fVar200 = local_448 * 0.33333334 + local_1e8;
    fVar228 = local_448 * 0.6666667 + local_1e8;
    fVar229 = local_448 * 1.0 + local_1e8;
    fVar282 = 1.0 - fVar199;
    fVar291 = 1.0 - fVar200;
    fVar293 = 1.0 - fVar228;
    fVar295 = 1.0 - fVar229;
    fVar302 = fVar155 * fVar282 + fVar198 * fVar199;
    fVar303 = fVar156 * fVar291 + fVar198 * fVar200;
    fVar305 = fVar157 * fVar293 + fVar198 * fVar228;
    fVar308 = fVar166 * fVar295 + fVar198 * fVar229;
    fVar230 = local_168 * fVar282 + local_178 * fVar199;
    fVar237 = fStack_164 * fVar291 + fStack_174 * fVar200;
    fVar238 = fStack_160 * fVar293 + fStack_170 * fVar228;
    fVar239 = fStack_15c * fVar295 + fStack_16c * fVar229;
    fVar314 = local_248 * fVar282 + local_188 * fVar199;
    fVar315 = fStack_244 * fVar291 + fStack_184 * fVar200;
    fVar316 = fStack_240 * fVar293 + fStack_180 * fVar228;
    fVar280 = fStack_23c * fVar295 + fStack_17c * fVar229;
    fVar290 = fVar84 * fVar282 + local_2a8 * fVar199;
    fVar292 = fVar127 * fVar291 + fStack_2a4 * fVar200;
    fVar294 = fVar128 * fVar293 + fStack_2a0 * fVar228;
    fVar296 = fVar129 * fVar295 + fStack_29c * fVar229;
    fVar251 = (local_218 * fVar282 + fVar155 * fVar199) * fVar282 + fVar199 * fVar302;
    fVar156 = (fStack_214 * fVar291 + fVar156 * fVar200) * fVar291 + fVar200 * fVar303;
    fVar157 = (fStack_210 * fVar293 + fVar157 * fVar228) * fVar293 + fVar228 * fVar305;
    fVar166 = (fStack_20c * fVar295 + fVar166 * fVar229) * fVar295 + fVar229 * fVar308;
    fVar252 = (local_228 * fVar282 + local_168 * fVar199) * fVar282 + fVar199 * fVar230;
    fVar258 = (fStack_224 * fVar291 + fStack_164 * fVar200) * fVar291 + fVar200 * fVar237;
    fVar270 = (fStack_220 * fVar293 + fStack_160 * fVar228) * fVar293 + fVar228 * fVar238;
    fVar271 = (fStack_21c * fVar295 + fStack_15c * fVar229) * fVar295 + fVar229 * fVar239;
    fVar307 = (local_238 * fVar282 + local_248 * fVar199) * fVar282 + fVar199 * fVar314;
    fVar253 = (fStack_234 * fVar291 + fStack_244 * fVar200) * fVar291 + fVar200 * fVar315;
    fVar256 = (fStack_230 * fVar293 + fStack_240 * fVar228) * fVar293 + fVar228 * fVar316;
    fVar257 = (fStack_22c * fVar295 + fStack_23c * fVar229) * fVar295 + fVar229 * fVar280;
    fVar272 = (local_158 * fVar282 + fVar84 * fVar199) * fVar282 + fVar199 * fVar290;
    fVar278 = (fStack_154 * fVar291 + fVar127 * fVar200) * fVar291 + fVar200 * fVar292;
    fVar279 = (fStack_150 * fVar293 + fVar128 * fVar228) * fVar293 + fVar228 * fVar294;
    fVar281 = (fStack_14c * fVar295 + fVar129 * fVar229) * fVar295 + fVar229 * fVar296;
    fVar302 = fVar302 * fVar282 + (fVar198 * fVar282 + local_198 * fVar199) * fVar199;
    fVar303 = fVar303 * fVar291 + (fVar198 * fVar291 + fStack_194 * fVar200) * fVar200;
    fVar305 = fVar305 * fVar293 + (fVar198 * fVar293 + fStack_190 * fVar228) * fVar228;
    fVar308 = fVar308 * fVar295 + (fVar198 * fVar295 + fStack_18c * fVar229) * fVar229;
    fVar127 = fVar230 * fVar282 + (local_178 * fVar282 + local_1a8 * fVar199) * fVar199;
    fVar128 = fVar237 * fVar291 + (fStack_174 * fVar291 + fStack_1a4 * fVar200) * fVar200;
    fVar129 = fVar238 * fVar293 + (fStack_170 * fVar293 + fStack_1a0 * fVar228) * fVar228;
    fVar155 = fVar239 * fVar295 + (fStack_16c * fVar295 + fStack_19c * fVar229) * fVar229;
    fVar239 = fVar314 * fVar282 + (local_188 * fVar282 + local_1b8 * fVar199) * fVar199;
    fVar314 = fVar315 * fVar291 + (fStack_184 * fVar291 + fStack_1b4 * fVar200) * fVar200;
    fVar315 = fVar316 * fVar293 + (fStack_180 * fVar293 + fStack_1b0 * fVar228) * fVar228;
    fVar316 = fVar280 * fVar295 + (fStack_17c * fVar295 + fStack_1ac * fVar229) * fVar229;
    fVar290 = fVar290 * fVar282 + (local_2a8 * fVar282 + local_1c8 * fVar199) * fVar199;
    fVar230 = fVar292 * fVar291 + (fStack_2a4 * fVar291 + fStack_1c4 * fVar200) * fVar200;
    fVar237 = fVar294 * fVar293 + (fStack_2a0 * fVar293 + fStack_1c0 * fVar228) * fVar228;
    fVar238 = fVar296 * fVar295 + (fStack_29c * fVar295 + fStack_1bc * fVar229) * fVar229;
    local_4d8 = fVar282 * fVar251 + fVar199 * fVar302;
    fStack_4d4 = fVar291 * fVar156 + fVar200 * fVar303;
    fStack_4d0 = fVar293 * fVar157 + fVar228 * fVar305;
    fStack_4cc = fVar295 * fVar166 + fVar229 * fVar308;
    fVar317 = fVar282 * fVar252 + fVar199 * fVar127;
    fVar318 = fVar291 * fVar258 + fVar200 * fVar128;
    fVar319 = fVar293 * fVar270 + fVar228 * fVar129;
    fVar320 = fVar295 * fVar271 + fVar229 * fVar155;
    fVar296 = fVar282 * fVar307 + fVar199 * fVar239;
    fVar280 = fVar291 * fVar253 + fVar200 * fVar314;
    fVar304 = fVar293 * fVar256 + fVar228 * fVar315;
    fVar306 = fVar295 * fVar257 + fVar229 * fVar316;
    fVar84 = local_448 * 0.11111111;
    fVar292 = fVar282 * fVar272 + fVar199 * fVar290;
    fVar294 = fVar291 * fVar278 + fVar200 * fVar230;
    auVar288._0_8_ = CONCAT44(fVar294,fVar292);
    auVar288._8_4_ = fVar293 * fVar279 + fVar228 * fVar237;
    auVar288._12_4_ = fVar295 * fVar281 + fVar229 * fVar238;
    local_3a8 = (fVar302 - fVar251) * 3.0 * fVar84;
    fStack_3a4 = (fVar303 - fVar156) * 3.0 * fVar84;
    fStack_3a0 = (fVar305 - fVar157) * 3.0 * fVar84;
    fStack_39c = (fVar308 - fVar166) * 3.0 * fVar84;
    local_3b8 = (fVar127 - fVar252) * 3.0 * fVar84;
    fStack_3b4 = (fVar128 - fVar258) * 3.0 * fVar84;
    fStack_3b0 = (fVar129 - fVar270) * 3.0 * fVar84;
    fStack_3ac = (fVar155 - fVar271) * 3.0 * fVar84;
    local_3c8 = (fVar239 - fVar307) * 3.0 * fVar84;
    fStack_3c4 = (fVar314 - fVar253) * 3.0 * fVar84;
    fStack_3c0 = (fVar315 - fVar256) * 3.0 * fVar84;
    fStack_3bc = (fVar316 - fVar257) * 3.0 * fVar84;
    fVar128 = fVar84 * (fVar230 - fVar278) * 3.0;
    fVar155 = fVar84 * (fVar237 - fVar279) * 3.0;
    fVar157 = fVar84 * (fVar238 - fVar281) * 3.0;
    local_3d8._4_4_ = fStack_4d0;
    local_3d8._0_4_ = fStack_4d4;
    fStack_3d0 = fStack_4cc;
    fStack_3cc = 0.0;
    local_3e8._4_4_ = fVar319;
    local_3e8._0_4_ = fVar318;
    local_3e8._8_4_ = fVar320;
    local_3e8._12_4_ = 0;
    auVar175._4_4_ = auVar288._8_4_;
    auVar175._0_4_ = fVar294;
    auVar175._8_4_ = auVar288._12_4_;
    auVar175._12_4_ = 0;
    auVar141._0_8_ = CONCAT44(auVar288._8_4_ - fVar155,fVar294 - fVar128);
    auVar141._8_4_ = auVar288._12_4_ - fVar157;
    auVar141._12_4_ = 0;
    local_328._0_4_ = fVar318 - fVar317;
    local_328._4_4_ = fVar319 - fVar318;
    fStack_320 = fVar320 - fVar319;
    fStack_31c = 0.0 - fVar320;
    local_3f8._4_4_ = fVar304;
    local_3f8._0_4_ = fVar280;
    local_3f8._8_4_ = fVar306;
    local_3f8._12_4_ = 0;
    local_338._0_4_ = fVar280 - fVar296;
    local_338._4_4_ = fVar304 - fVar280;
    fStack_330 = fVar306 - fVar304;
    fStack_32c = 0.0 - fVar306;
    fVar199 = local_3b8 * (float)local_338._0_4_ - local_3c8 * (float)local_328._0_4_;
    fVar200 = fStack_3b4 * (float)local_338._4_4_ - fStack_3c4 * (float)local_328._4_4_;
    fVar228 = fStack_3b0 * fStack_330 - fStack_3c0 * fStack_320;
    fVar229 = fStack_3ac * fStack_32c - fStack_3bc * fStack_31c;
    local_348 = fStack_4d4 - local_4d8;
    fStack_344 = fStack_4d0 - fStack_4d4;
    fStack_340 = fStack_4cc - fStack_4d0;
    fStack_33c = 0.0 - fStack_4cc;
    fVar230 = local_3c8 * local_348 - local_3a8 * (float)local_338._0_4_;
    fVar237 = fStack_3c4 * fStack_344 - fStack_3a4 * (float)local_338._4_4_;
    fVar238 = fStack_3c0 * fStack_340 - fStack_3a0 * fStack_330;
    fVar239 = fStack_3bc * fStack_33c - fStack_39c * fStack_32c;
    fVar251 = local_3a8 * (float)local_328._0_4_ - local_3b8 * local_348;
    fVar252 = fStack_3a4 * (float)local_328._4_4_ - fStack_3b4 * fStack_344;
    fVar258 = fStack_3a0 * fStack_320 - fStack_3b0 * fStack_340;
    fVar270 = fStack_39c * fStack_31c - fStack_3ac * fStack_33c;
    auVar245._0_4_ =
         (float)local_328._0_4_ * (float)local_328._0_4_ +
         (float)local_338._0_4_ * (float)local_338._0_4_;
    auVar245._4_4_ =
         (float)local_328._4_4_ * (float)local_328._4_4_ +
         (float)local_338._4_4_ * (float)local_338._4_4_;
    auVar245._8_4_ = fStack_320 * fStack_320 + fStack_330 * fStack_330;
    auVar245._12_4_ = fStack_31c * fStack_31c + fStack_32c * fStack_32c;
    auVar232._0_4_ = local_348 * local_348 + auVar245._0_4_;
    auVar232._4_4_ = fStack_344 * fStack_344 + auVar245._4_4_;
    auVar232._8_4_ = fStack_340 * fStack_340 + auVar245._8_4_;
    auVar232._12_4_ = fStack_33c * fStack_33c + auVar245._12_4_;
    auVar85 = rcpps(auVar245,auVar232);
    fVar127 = auVar85._0_4_;
    fVar129 = auVar85._4_4_;
    fVar156 = auVar85._8_4_;
    fVar166 = auVar85._12_4_;
    fVar127 = (1.0 - fVar127 * auVar232._0_4_) * fVar127 + fVar127;
    fVar129 = (1.0 - fVar129 * auVar232._4_4_) * fVar129 + fVar129;
    fVar156 = (1.0 - fVar156 * auVar232._8_4_) * fVar156 + fVar156;
    fVar166 = (1.0 - fVar166 * auVar232._12_4_) * fVar166 + fVar166;
    fVar271 = (float)local_338._0_4_ * fStack_3b4 - (float)local_328._0_4_ * fStack_3c4;
    fVar307 = (float)local_338._4_4_ * fStack_3b0 - (float)local_328._4_4_ * fStack_3c0;
    fVar253 = fStack_330 * fStack_3ac - fStack_320 * fStack_3bc;
    fVar256 = fStack_32c * 0.0 - fStack_31c * 0.0;
    local_428 = fStack_3c4;
    fStack_424 = fStack_3c0;
    fStack_420 = fStack_3bc;
    fStack_41c = 0.0;
    fVar257 = local_348 * fStack_3c4 - (float)local_338._0_4_ * fStack_3a4;
    fVar278 = fStack_344 * fStack_3c0 - (float)local_338._4_4_ * fStack_3a0;
    fVar279 = fStack_340 * fStack_3bc - fStack_330 * fStack_39c;
    fVar281 = fStack_33c * 0.0 - fStack_32c * 0.0;
    local_418 = fStack_3b4;
    fStack_414 = fStack_3b0;
    fStack_410 = fStack_3ac;
    fStack_40c = 0.0;
    local_408 = fStack_3a4;
    fStack_404 = fStack_3a0;
    fStack_400 = fStack_39c;
    fStack_3fc = 0.0;
    fVar302 = (float)local_328._0_4_ * fStack_3a4 - local_348 * fStack_3b4;
    fVar303 = (float)local_328._4_4_ * fStack_3a0 - fStack_344 * fStack_3b0;
    fVar305 = fStack_320 * fStack_39c - fStack_340 * fStack_3ac;
    fVar308 = fStack_31c * 0.0 - fStack_33c * 0.0;
    auVar217._0_4_ = (fVar199 * fVar199 + fVar230 * fVar230 + fVar251 * fVar251) * fVar127;
    auVar217._4_4_ = (fVar200 * fVar200 + fVar237 * fVar237 + fVar252 * fVar252) * fVar129;
    auVar217._8_4_ = (fVar228 * fVar228 + fVar238 * fVar238 + fVar258 * fVar258) * fVar156;
    auVar217._12_4_ = (fVar229 * fVar229 + fVar239 * fVar239 + fVar270 * fVar270) * fVar166;
    auVar254._0_4_ = (fVar271 * fVar271 + fVar257 * fVar257 + fVar302 * fVar302) * fVar127;
    auVar254._4_4_ = (fVar307 * fVar307 + fVar278 * fVar278 + fVar303 * fVar303) * fVar129;
    auVar254._8_4_ = (fVar253 * fVar253 + fVar279 * fVar279 + fVar305 * fVar305) * fVar156;
    auVar254._12_4_ = (fVar256 * fVar256 + fVar281 * fVar281 + fVar308 * fVar308) * fVar166;
    auVar263 = maxps(auVar217,auVar254);
    auVar106._8_4_ = auVar288._8_4_;
    auVar106._0_8_ = auVar288._0_8_;
    auVar106._12_4_ = auVar288._12_4_;
    auVar29._4_4_ = fVar294 + fVar128;
    auVar29._0_4_ = fVar292 + fVar84 * (fVar290 - fVar272) * 3.0;
    auVar29._8_4_ = auVar288._8_4_ + fVar155;
    auVar29._12_4_ = auVar288._12_4_ + fVar157;
    auVar85 = maxps(auVar106,auVar29);
    auVar246._8_4_ = auVar141._8_4_;
    auVar246._0_8_ = auVar141._0_8_;
    auVar246._12_4_ = 0;
    auVar159 = maxps(auVar246,auVar175);
    auVar85 = maxps(auVar85,auVar159);
    auVar289 = minps(auVar288,auVar29);
    auVar159 = minps(auVar141,auVar175);
    auVar289 = minps(auVar289,auVar159);
    auVar159 = sqrtps(auVar159,auVar263);
    auVar263 = rsqrtps(auVar175,auVar232);
    fVar84 = auVar263._0_4_;
    fVar127 = auVar263._4_4_;
    fVar128 = auVar263._8_4_;
    fVar129 = auVar263._12_4_;
    fVar155 = fVar84 * fVar84 * auVar232._0_4_ * -0.5 * fVar84 + fVar84 * 1.5;
    fVar156 = fVar127 * fVar127 * auVar232._4_4_ * -0.5 * fVar127 + fVar127 * 1.5;
    fVar157 = fVar128 * fVar128 * auVar232._8_4_ * -0.5 * fVar128 + fVar128 * 1.5;
    fVar166 = fVar129 * fVar129 * auVar232._12_4_ * -0.5 * fVar129 + fVar129 * 1.5;
    fVar230 = 0.0 - fVar317;
    fVar238 = 0.0 - fVar318;
    fVar251 = 0.0 - fVar319;
    fVar258 = 0.0 - fVar320;
    local_438 = 0.0 - fVar296;
    fStack_434 = 0.0 - fVar280;
    fStack_430 = 0.0 - fVar304;
    fStack_42c = 0.0 - fVar306;
    auVar33._4_4_ = fStack_474;
    auVar33._0_4_ = local_478;
    auVar33._8_4_ = fStack_470;
    auVar33._12_4_ = fStack_46c;
    fVar271 = 0.0 - local_4d8;
    fVar253 = 0.0 - fStack_4d4;
    fVar257 = 0.0 - fStack_4d0;
    fVar278 = 0.0 - fStack_4cc;
    auVar233._0_4_ = local_548 * (float)local_338._0_4_ * fVar155;
    auVar233._4_4_ = fStack_544 * (float)local_338._4_4_ * fVar156;
    auVar233._8_4_ = fStack_540 * fStack_330 * fVar157;
    auVar233._12_4_ = fStack_53c * fStack_32c * fVar166;
    fVar199 = local_318 * local_348 * fVar155 +
              local_478 * (float)local_328._0_4_ * fVar155 + auVar233._0_4_;
    fVar200 = fStack_314 * fStack_344 * fVar156 +
              fStack_474 * (float)local_328._4_4_ * fVar156 + auVar233._4_4_;
    fVar228 = fStack_310 * fStack_340 * fVar157 + fStack_470 * fStack_320 * fVar157 + auVar233._8_4_
    ;
    fVar229 = fStack_30c * fStack_33c * fVar166 +
              fStack_46c * fStack_31c * fVar166 + auVar233._12_4_;
    local_4e8 = local_348 * fVar155 * fVar271 +
                (float)local_328._0_4_ * fVar155 * fVar230 +
                (float)local_338._0_4_ * fVar155 * local_438;
    fStack_4e4 = fStack_344 * fVar156 * fVar253 +
                 (float)local_328._4_4_ * fVar156 * fVar238 +
                 (float)local_338._4_4_ * fVar156 * fStack_434;
    fStack_4e0 = fStack_340 * fVar157 * fVar257 +
                 fStack_320 * fVar157 * fVar251 + fStack_330 * fVar157 * fStack_430;
    fStack_4dc = fStack_33c * fVar166 * fVar278 +
                 fStack_31c * fVar166 * fVar258 + fStack_32c * fVar166 * fStack_42c;
    local_1d8 = (local_318 * fVar271 + local_478 * fVar230 + local_548 * local_438) -
                fVar199 * local_4e8;
    fStack_1d4 = (fStack_314 * fVar253 + fStack_474 * fVar238 + fStack_544 * fStack_434) -
                 fVar200 * fStack_4e4;
    fStack_1d0 = (fStack_310 * fVar257 + fStack_470 * fVar251 + fStack_540 * fStack_430) -
                 fVar228 * fStack_4e0;
    fStack_1cc = (fStack_30c * fVar278 + fStack_46c * fVar258 + fStack_53c * fStack_42c) -
                 fVar229 * fStack_4dc;
    fVar281 = (fVar271 * fVar271 + fVar230 * fVar230 + local_438 * local_438) -
              local_4e8 * local_4e8;
    fVar290 = (fVar253 * fVar253 + fVar238 * fVar238 + fStack_434 * fStack_434) -
              fStack_4e4 * fStack_4e4;
    fVar292 = (fVar257 * fVar257 + fVar251 * fVar251 + fStack_430 * fStack_430) -
              fStack_4e0 * fStack_4e0;
    fVar294 = (fVar278 * fVar278 + fVar258 * fVar258 + fStack_42c * fStack_42c) -
              fStack_4dc * fStack_4dc;
    fVar84 = (auVar85._0_4_ + auVar159._0_4_) * 1.0000002;
    fVar127 = (auVar85._4_4_ + auVar159._4_4_) * 1.0000002;
    fVar128 = (auVar85._8_4_ + auVar159._8_4_) * 1.0000002;
    fVar129 = (auVar85._12_4_ + auVar159._12_4_) * 1.0000002;
    fVar307 = fVar281 - fVar84 * fVar84;
    fVar256 = fVar290 - fVar127 * fVar127;
    fVar272 = fVar292 - fVar128 * fVar128;
    fVar279 = fVar294 - fVar129 * fVar129;
    fVar84 = fVar199 * fVar199;
    fVar127 = fVar200 * fVar200;
    fVar128 = fVar228 * fVar228;
    fVar129 = fVar229 * fVar229;
    fVar237 = local_148 - fVar84;
    fVar239 = fStack_144 - fVar127;
    fVar252 = fStack_140 - fVar128;
    fVar270 = fStack_13c - fVar129;
    local_1d8 = local_1d8 + local_1d8;
    fStack_1d4 = fStack_1d4 + fStack_1d4;
    fStack_1d0 = fStack_1d0 + fStack_1d0;
    fStack_1cc = fStack_1cc + fStack_1cc;
    local_518._0_4_ = fVar237 * 4.0;
    local_518._4_4_ = fVar239 * 4.0;
    fStack_510 = fVar252 * 4.0;
    fStack_50c = fVar270 * 4.0;
    auVar107._0_4_ = local_1d8 * local_1d8 - (float)local_518._0_4_ * fVar307;
    auVar107._4_4_ = fStack_1d4 * fStack_1d4 - (float)local_518._4_4_ * fVar256;
    auVar107._8_4_ = fStack_1d0 * fStack_1d0 - fStack_510 * fVar272;
    auVar107._12_4_ = fStack_1cc * fStack_1cc - fStack_50c * fVar279;
    local_508._4_4_ = (auVar289._4_4_ - auVar159._4_4_) * 0.99999976;
    local_508._0_4_ = (auVar289._0_4_ - auVar159._0_4_) * 0.99999976;
    fStack_500 = (auVar289._8_4_ - auVar159._8_4_) * 0.99999976;
    fStack_4fc = (auVar289._12_4_ - auVar159._12_4_) * 0.99999976;
    auVar218._4_4_ = -(uint)(0.0 <= auVar107._4_4_);
    auVar218._0_4_ = -(uint)(0.0 <= auVar107._0_4_);
    auVar218._8_4_ = -(uint)(0.0 <= auVar107._8_4_);
    auVar218._12_4_ = -(uint)(0.0 <= auVar107._12_4_);
    uVar69 = (undefined4)((ulong)lVar67 >> 0x20);
    iVar63 = movmskps((int)lVar67,auVar218);
    if (iVar63 == 0) {
      iVar63 = 0;
      auVar255 = _DAT_01f7aa00;
      auVar321 = _DAT_01f7a9f0;
    }
    else {
      auVar159 = sqrtps(auVar33,auVar107);
      bVar25 = 0.0 <= auVar107._0_4_;
      uVar79 = -(uint)bVar25;
      bVar26 = 0.0 <= auVar107._4_4_;
      uVar81 = -(uint)bVar26;
      bVar27 = 0.0 <= auVar107._8_4_;
      uVar80 = -(uint)bVar27;
      bVar28 = 0.0 <= auVar107._12_4_;
      uVar82 = -(uint)bVar28;
      auVar142._0_4_ = fVar237 + fVar237;
      auVar142._4_4_ = fVar239 + fVar239;
      auVar142._8_4_ = fVar252 + fVar252;
      auVar142._12_4_ = fVar270 + fVar270;
      auVar85 = rcpps(auVar233,auVar142);
      fVar314 = auVar85._0_4_;
      fVar315 = auVar85._4_4_;
      fVar316 = auVar85._8_4_;
      fVar282 = auVar85._12_4_;
      fVar314 = (1.0 - auVar142._0_4_ * fVar314) * fVar314 + fVar314;
      fVar315 = (1.0 - auVar142._4_4_ * fVar315) * fVar315 + fVar315;
      fVar316 = (1.0 - auVar142._8_4_ * fVar316) * fVar316 + fVar316;
      fVar282 = (1.0 - auVar142._12_4_ * fVar282) * fVar282 + fVar282;
      fVar302 = (-local_1d8 - auVar159._0_4_) * fVar314;
      fVar303 = (-fStack_1d4 - auVar159._4_4_) * fVar315;
      fVar305 = (-fStack_1d0 - auVar159._8_4_) * fVar316;
      fVar308 = (-fStack_1cc - auVar159._12_4_) * fVar282;
      fVar314 = (auVar159._0_4_ - local_1d8) * fVar314;
      fVar315 = (auVar159._4_4_ - fStack_1d4) * fVar315;
      fVar316 = (auVar159._8_4_ - fStack_1d0) * fVar316;
      fVar282 = (auVar159._12_4_ - fStack_1cc) * fVar282;
      local_208 = (fVar199 * fVar302 + local_4e8) * fVar155;
      fStack_204 = (fVar200 * fVar303 + fStack_4e4) * fVar156;
      fStack_200 = (fVar228 * fVar305 + fStack_4e0) * fVar157;
      fStack_1fc = (fVar229 * fVar308 + fStack_4dc) * fVar166;
      local_488._4_4_ = (fVar200 * fVar315 + fStack_4e4) * fVar156;
      local_488._0_4_ = (fVar199 * fVar314 + local_4e8) * fVar155;
      fStack_480 = (fVar228 * fVar316 + fStack_4e0) * fVar157;
      fStack_47c = (fVar229 * fVar282 + fStack_4dc) * fVar166;
      auVar143._0_4_ = (uint)fVar302 & uVar79;
      auVar143._4_4_ = (uint)fVar303 & uVar81;
      auVar143._8_4_ = (uint)fVar305 & uVar80;
      auVar143._12_4_ = (uint)fVar308 & uVar82;
      auVar321._0_8_ = CONCAT44(~uVar81,~uVar79) & 0x7f8000007f800000;
      auVar321._8_4_ = ~uVar80 & 0x7f800000;
      auVar321._12_4_ = ~uVar82 & 0x7f800000;
      auVar321 = auVar321 | auVar143;
      auVar309._0_4_ = (uint)fVar314 & uVar79;
      auVar309._4_4_ = (uint)fVar315 & uVar81;
      auVar309._8_4_ = (uint)fVar316 & uVar80;
      auVar309._12_4_ = (uint)fVar282 & uVar82;
      auVar255._0_8_ = CONCAT44(~uVar81,~uVar79) & 0xff800000ff800000;
      auVar255._8_4_ = ~uVar80 & 0xff800000;
      auVar255._12_4_ = ~uVar82 & 0xff800000;
      auVar255 = auVar255 | auVar309;
      auVar234._0_8_ = CONCAT44(fVar127,fVar84) & 0x7fffffff7fffffff;
      auVar234._8_4_ = ABS(fVar128);
      auVar234._12_4_ = ABS(fVar129);
      auVar38._4_4_ = fStack_2b4;
      auVar38._0_4_ = local_2b8;
      auVar38._8_4_ = fStack_2b0;
      auVar38._12_4_ = fStack_2ac;
      auVar85 = maxps(auVar38,auVar234);
      fVar302 = auVar85._0_4_ * 1.9073486e-06;
      fVar303 = auVar85._4_4_ * 1.9073486e-06;
      fVar305 = auVar85._8_4_ * 1.9073486e-06;
      fVar308 = auVar85._12_4_ * 1.9073486e-06;
      auVar310._0_4_ = -(uint)(ABS(fVar237) < fVar302 && bVar25);
      auVar310._4_4_ = -(uint)(ABS(fVar239) < fVar303 && bVar26);
      auVar310._8_4_ = -(uint)(ABS(fVar252) < fVar305 && bVar27);
      auVar310._12_4_ = -(uint)(ABS(fVar270) < fVar308 && bVar28);
      iVar63 = movmskps(iVar63,auVar310);
      if (iVar63 != 0) {
        uVar79 = -(uint)(fVar307 <= 0.0);
        uVar81 = -(uint)(fVar256 <= 0.0);
        uVar80 = -(uint)(fVar272 <= 0.0);
        uVar82 = -(uint)(fVar279 <= 0.0);
        auVar219._0_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar310._0_4_;
        auVar219._4_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar310._4_4_;
        auVar219._8_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar310._8_4_;
        auVar219._12_4_ = (uVar82 & 0xff800000 | ~uVar82 & 0x7f800000) & auVar310._12_4_;
        auVar144._0_4_ = ~auVar310._0_4_ & auVar321._0_4_;
        auVar144._4_4_ = ~auVar310._4_4_ & auVar321._4_4_;
        auVar144._8_4_ = ~auVar310._8_4_ & auVar321._8_4_;
        auVar144._12_4_ = ~auVar310._12_4_ & auVar321._12_4_;
        auVar322._0_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar310._0_4_;
        auVar322._4_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar310._4_4_;
        auVar322._8_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar310._8_4_;
        auVar322._12_4_ = (uVar82 & 0x7f800000 | ~uVar82 & 0xff800000) & auVar310._12_4_;
        auVar311._0_4_ = ~auVar310._0_4_ & auVar255._0_4_;
        auVar311._4_4_ = ~auVar310._4_4_ & auVar255._4_4_;
        auVar311._8_4_ = ~auVar310._8_4_ & auVar255._8_4_;
        auVar311._12_4_ = ~auVar310._12_4_ & auVar255._12_4_;
        auVar218._4_4_ = -(uint)((fVar303 <= ABS(fVar239) || fVar256 <= 0.0) && bVar26);
        auVar218._0_4_ = -(uint)((fVar302 <= ABS(fVar237) || fVar307 <= 0.0) && bVar25);
        auVar218._8_4_ = -(uint)((fVar305 <= ABS(fVar252) || fVar272 <= 0.0) && bVar27);
        auVar218._12_4_ = -(uint)((fVar308 <= ABS(fVar270) || fVar279 <= 0.0) && bVar28);
        auVar255 = auVar311 | auVar322;
        auVar321 = auVar144 | auVar219;
      }
    }
    auVar30._4_4_ = fStack_544;
    auVar30._0_4_ = local_548;
    auVar30._8_4_ = fStack_540;
    auVar30._12_4_ = fStack_53c;
    auVar220._0_4_ = (auVar218._0_4_ << 0x1f) >> 0x1f;
    auVar220._4_4_ = (auVar218._4_4_ << 0x1f) >> 0x1f;
    auVar220._8_4_ = (auVar218._8_4_ << 0x1f) >> 0x1f;
    auVar220._12_4_ = (auVar218._12_4_ << 0x1f) >> 0x1f;
    auVar220 = auVar220 & local_1f8;
    iVar63 = movmskps(iVar63,auVar220);
    if (iVar63 != 0) {
      local_538._4_4_ = fVar290;
      local_538._0_4_ = fVar281;
      fStack_530 = fVar292;
      fStack_52c = fVar294;
      local_268 = fVar84;
      fStack_264 = fVar127;
      fStack_260 = fVar128;
      fStack_25c = fVar129;
      local_258 = fVar199;
      fStack_254 = fVar200;
      fStack_250 = fVar228;
      fStack_24c = fVar229;
      local_2d8 = fVar237;
      fStack_2d4 = fVar239;
      fStack_2d0 = fVar252;
      fStack_2cc = fVar270;
      local_2c8 = fVar155;
      fStack_2c4 = fVar156;
      fStack_2c0 = fVar157;
      fStack_2bc = fVar166;
      auVar247._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_308._0_4_;
      auVar247._4_4_ = auVar247._0_4_;
      auVar247._8_4_ = auVar247._0_4_;
      auVar247._12_4_ = auVar247._0_4_;
      auVar159 = maxps(auVar247,auVar321);
      auVar277._0_4_ = (ray->super_RayK<1>).tfar - (float)local_308._0_4_;
      auVar277._4_4_ = auVar277._0_4_;
      auVar277._8_4_ = auVar277._0_4_;
      auVar277._12_4_ = auVar277._0_4_;
      auVar263 = minps(auVar277,auVar255);
      auVar264._0_4_ = local_3a8 * local_318 + local_3b8 * local_478 + local_3c8 * local_548;
      auVar264._4_4_ = fStack_3a4 * fStack_314 + fStack_3b4 * fStack_474 + fStack_3c4 * fStack_544;
      auVar264._8_4_ = fStack_3a0 * fStack_310 + fStack_3b0 * fStack_470 + fStack_3c0 * fStack_540;
      auVar264._12_4_ = fStack_39c * fStack_30c + fStack_3ac * fStack_46c + fStack_3bc * fStack_53c;
      auVar85 = rcpps(auVar30,auVar264);
      fVar307 = auVar85._0_4_;
      fVar256 = auVar85._4_4_;
      fVar272 = auVar85._8_4_;
      fVar279 = auVar85._12_4_;
      fVar230 = ((1.0 - auVar264._0_4_ * fVar307) * fVar307 + fVar307) *
                -(fVar271 * local_3a8 + fVar230 * local_3b8 + local_438 * local_3c8);
      fVar238 = ((1.0 - auVar264._4_4_ * fVar256) * fVar256 + fVar256) *
                -(fVar253 * fStack_3a4 + fVar238 * fStack_3b4 + fStack_434 * fStack_3c4);
      fVar251 = ((1.0 - auVar264._8_4_ * fVar272) * fVar272 + fVar272) *
                -(fVar257 * fStack_3a0 + fVar251 * fStack_3b0 + fStack_430 * fStack_3c0);
      fVar258 = ((1.0 - auVar264._12_4_ * fVar279) * fVar279 + fVar279) *
                -(fVar278 * fStack_39c + fVar258 * fStack_3ac + fStack_42c * fStack_3bc);
      uVar79 = -(uint)(auVar264._0_4_ < 0.0 || ABS(auVar264._0_4_) < 1e-18);
      uVar81 = -(uint)(auVar264._4_4_ < 0.0 || ABS(auVar264._4_4_) < 1e-18);
      uVar80 = -(uint)(auVar264._8_4_ < 0.0 || ABS(auVar264._8_4_) < 1e-18);
      uVar82 = -(uint)(auVar264._12_4_ < 0.0 || ABS(auVar264._12_4_) < 1e-18);
      auVar191._0_8_ = CONCAT44(uVar81,uVar79) & 0xff800000ff800000;
      auVar191._8_4_ = uVar80 & 0xff800000;
      auVar191._12_4_ = uVar82 & 0xff800000;
      auVar108._0_4_ = ~uVar79 & (uint)fVar230;
      auVar108._4_4_ = ~uVar81 & (uint)fVar238;
      auVar108._8_4_ = ~uVar80 & (uint)fVar251;
      auVar108._12_4_ = ~uVar82 & (uint)fVar258;
      auVar159 = maxps(auVar159,auVar108 | auVar191);
      uVar79 = -(uint)(0.0 < auVar264._0_4_ || ABS(auVar264._0_4_) < 1e-18);
      uVar81 = -(uint)(0.0 < auVar264._4_4_ || ABS(auVar264._4_4_) < 1e-18);
      uVar80 = -(uint)(0.0 < auVar264._8_4_ || ABS(auVar264._8_4_) < 1e-18);
      uVar82 = -(uint)(0.0 < auVar264._12_4_ || ABS(auVar264._12_4_) < 1e-18);
      auVar109._0_8_ = CONCAT44(uVar81,uVar79) & 0x7f8000007f800000;
      auVar109._8_4_ = uVar80 & 0x7f800000;
      auVar109._12_4_ = uVar82 & 0x7f800000;
      auVar265._0_4_ = ~uVar79 & (uint)fVar230;
      auVar265._4_4_ = ~uVar81 & (uint)fVar238;
      auVar265._8_4_ = ~uVar80 & (uint)fVar251;
      auVar265._12_4_ = ~uVar82 & (uint)fVar258;
      auVar263 = minps(auVar263,auVar265 | auVar109);
      auVar145._0_4_ = (0.0 - fVar318) * -fStack_3b4 + (0.0 - fVar280) * -fStack_3c4;
      auVar145._4_4_ = (0.0 - fVar319) * -fStack_3b0 + (0.0 - fVar304) * -fStack_3c0;
      auVar145._8_4_ = (0.0 - fVar320) * -fStack_3ac + (0.0 - fVar306) * -fStack_3bc;
      auVar145._12_4_ = 0x80000000;
      auVar266._0_4_ = -fStack_3a4 * local_318 + -fStack_3b4 * local_478 + -fStack_3c4 * local_548;
      auVar266._4_4_ =
           -fStack_3a0 * fStack_314 + -fStack_3b0 * fStack_474 + -fStack_3c0 * fStack_544;
      auVar266._8_4_ =
           -fStack_39c * fStack_310 + -fStack_3ac * fStack_470 + -fStack_3bc * fStack_540;
      auVar266._12_4_ = fStack_30c * -0.0 + fStack_46c * -0.0 + fStack_53c * -0.0;
      auVar85 = rcpps(auVar145,auVar266);
      fVar230 = auVar85._0_4_;
      fVar238 = auVar85._4_4_;
      fVar251 = auVar85._8_4_;
      fVar258 = auVar85._12_4_;
      fVar230 = (((float)DAT_01f7ba10 - auVar266._0_4_ * fVar230) * fVar230 + fVar230) *
                -((0.0 - fStack_4d4) * -fStack_3a4 + auVar145._0_4_);
      fVar238 = ((DAT_01f7ba10._4_4_ - auVar266._4_4_ * fVar238) * fVar238 + fVar238) *
                -((0.0 - fStack_4d0) * -fStack_3a0 + auVar145._4_4_);
      fVar251 = ((DAT_01f7ba10._8_4_ - auVar266._8_4_ * fVar251) * fVar251 + fVar251) *
                -((0.0 - fStack_4cc) * -fStack_39c + auVar145._8_4_);
      fVar258 = ((DAT_01f7ba10._12_4_ - auVar266._12_4_ * fVar258) * fVar258 + fVar258) * 0.0;
      uVar79 = -(uint)(auVar266._0_4_ < 0.0 || ABS(auVar266._0_4_) < 1e-18);
      uVar81 = -(uint)(auVar266._4_4_ < 0.0 || ABS(auVar266._4_4_) < 1e-18);
      uVar80 = -(uint)(auVar266._8_4_ < 0.0 || ABS(auVar266._8_4_) < 1e-18);
      uVar82 = -(uint)(auVar266._12_4_ < 0.0 || ABS(auVar266._12_4_) < 1e-18);
      auVar146._0_8_ = CONCAT44(uVar81,uVar79) & 0xff800000ff800000;
      auVar146._8_4_ = uVar80 & 0xff800000;
      auVar146._12_4_ = uVar82 & 0xff800000;
      auVar110._0_4_ = ~uVar79 & (uint)fVar230;
      auVar110._4_4_ = ~uVar81 & (uint)fVar238;
      auVar110._8_4_ = ~uVar80 & (uint)fVar251;
      auVar110._12_4_ = ~uVar82 & (uint)fVar258;
      _local_458 = maxps(auVar159,auVar110 | auVar146);
      uVar79 = -(uint)(0.0 < auVar266._0_4_ || ABS(auVar266._0_4_) < 1e-18);
      uVar81 = -(uint)(0.0 < auVar266._4_4_ || ABS(auVar266._4_4_) < 1e-18);
      uVar80 = -(uint)(0.0 < auVar266._8_4_ || ABS(auVar266._8_4_) < 1e-18);
      uVar82 = -(uint)(0.0 < auVar266._12_4_ || ABS(auVar266._12_4_) < 1e-18);
      auVar111._0_8_ = CONCAT44(uVar81,uVar79) & 0x7f8000007f800000;
      auVar111._8_4_ = uVar80 & 0x7f800000;
      auVar111._12_4_ = uVar82 & 0x7f800000;
      auVar267._0_4_ = ~uVar79 & (uint)fVar230;
      auVar267._4_4_ = ~uVar81 & (uint)fVar238;
      auVar267._8_4_ = ~uVar80 & (uint)fVar251;
      auVar267._12_4_ = ~uVar82 & (uint)fVar258;
      auVar85 = minps(auVar263,auVar267 | auVar111);
      fVar230 = local_458._12_4_;
      fVar238 = local_458._0_4_;
      fVar251 = local_458._4_4_;
      fVar258 = local_458._8_4_;
      auVar312._0_4_ = -(uint)(fVar238 <= auVar85._0_4_) & auVar220._0_4_;
      auVar312._4_4_ = -(uint)(fVar251 <= auVar85._4_4_) & auVar220._4_4_;
      auVar312._8_4_ = -(uint)(fVar258 <= auVar85._8_4_) & auVar220._8_4_;
      auVar312._12_4_ = -(uint)(fVar230 <= auVar85._12_4_) & auVar220._12_4_;
      iVar63 = movmskps(iVar63,auVar312);
      if (iVar63 != 0) {
        auVar159 = maxps(ZEXT816(0),_local_508);
        auVar40._4_4_ = fStack_204;
        auVar40._0_4_ = local_208;
        auVar40._8_4_ = fStack_200;
        auVar40._12_4_ = fStack_1fc;
        auVar263 = minps(auVar40,_DAT_01f7ba10);
        auVar192._0_12_ = ZEXT812(0);
        auVar192._12_4_ = 0.0;
        auVar289 = maxps(auVar263,auVar192);
        auVar263 = minps(_local_488,_DAT_01f7ba10);
        auVar263 = maxps(auVar263,auVar192);
        local_108._0_4_ = (auVar289._0_4_ + 0.0) * 0.25 * local_448 + local_1e8;
        local_108._4_4_ = (auVar289._4_4_ + 1.0) * 0.25 * local_448 + local_1e8;
        local_108._8_4_ = (auVar289._8_4_ + 2.0) * 0.25 * local_448 + local_1e8;
        local_108._12_4_ = (auVar289._12_4_ + 3.0) * 0.25 * local_448 + local_1e8;
        local_118[0] = (auVar263._0_4_ + 0.0) * 0.25 * local_448 + local_1e8;
        local_118[1] = (auVar263._4_4_ + 1.0) * 0.25 * local_448 + local_1e8;
        local_118[2] = (auVar263._8_4_ + 2.0) * 0.25 * local_448 + local_1e8;
        local_118[3] = (auVar263._12_4_ + 3.0) * 0.25 * local_448 + local_1e8;
        local_538._0_4_ = fVar281 - auVar159._0_4_ * auVar159._0_4_;
        local_538._4_4_ = fVar290 - auVar159._4_4_ * auVar159._4_4_;
        fStack_530 = fVar292 - auVar159._8_4_ * auVar159._8_4_;
        fStack_52c = fVar294 - auVar159._12_4_ * auVar159._12_4_;
        auVar176._0_4_ = local_1d8 * local_1d8 - (float)local_518._0_4_ * (float)local_538._0_4_;
        auVar176._4_4_ = fStack_1d4 * fStack_1d4 - (float)local_518._4_4_ * (float)local_538._4_4_;
        auVar176._8_4_ = fStack_1d0 * fStack_1d0 - fStack_510 * fStack_530;
        auVar176._12_4_ = fStack_1cc * fStack_1cc - fStack_50c * fStack_52c;
        local_488._4_4_ = -(uint)(0.0 <= auVar176._4_4_);
        local_488._0_4_ = -(uint)(0.0 <= auVar176._0_4_);
        fStack_480 = (float)-(uint)(0.0 <= auVar176._8_4_);
        fStack_47c = (float)-(uint)(0.0 <= auVar176._12_4_);
        iVar63 = movmskps(iVar63,_local_488);
        if (iVar63 == 0) {
          _local_5a8 = ZEXT816(0);
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar228 = 0.0;
          fVar229 = 0.0;
          fVar271 = 0.0;
          fVar307 = 0.0;
          fVar253 = 0.0;
          fVar256 = 0.0;
          fVar257 = 0.0;
          fVar272 = 0.0;
          fVar278 = 0.0;
          fVar279 = 0.0;
          _local_508 = ZEXT816(0);
          iVar63 = 0;
          auVar147 = _DAT_01f7aa00;
          auVar177 = _DAT_01f7a9f0;
        }
        else {
          auVar263 = sqrtps(local_108,auVar176);
          auVar112._0_4_ = fVar237 + fVar237;
          auVar112._4_4_ = fVar239 + fVar239;
          auVar112._8_4_ = fVar252 + fVar252;
          auVar112._12_4_ = fVar270 + fVar270;
          auVar159 = rcpps(_local_538,auVar112);
          fVar281 = auVar159._0_4_;
          fVar290 = auVar159._4_4_;
          fVar292 = auVar159._8_4_;
          fVar294 = auVar159._12_4_;
          fVar281 = ((float)DAT_01f7ba10 - auVar112._0_4_ * fVar281) * fVar281 + fVar281;
          fVar290 = (DAT_01f7ba10._4_4_ - auVar112._4_4_ * fVar290) * fVar290 + fVar290;
          fVar292 = (DAT_01f7ba10._8_4_ - auVar112._8_4_ * fVar292) * fVar292 + fVar292;
          fVar294 = (DAT_01f7ba10._12_4_ - auVar112._12_4_ * fVar294) * fVar294 + fVar294;
          fVar314 = (-local_1d8 - auVar263._0_4_) * fVar281;
          fVar315 = (-fStack_1d4 - auVar263._4_4_) * fVar290;
          fVar316 = (-fStack_1d0 - auVar263._8_4_) * fVar292;
          fVar282 = (-fStack_1cc - auVar263._12_4_) * fVar294;
          fVar281 = (auVar263._0_4_ - local_1d8) * fVar281;
          fVar290 = (auVar263._4_4_ - fStack_1d4) * fVar290;
          fVar292 = (auVar263._8_4_ - fStack_1d0) * fVar292;
          fVar294 = (auVar263._12_4_ - fStack_1cc) * fVar294;
          fVar302 = (fVar199 * fVar314 + local_4e8) * fVar155;
          fVar303 = (fVar200 * fVar315 + fStack_4e4) * fVar156;
          fVar305 = (fVar228 * fVar316 + fStack_4e0) * fVar157;
          fVar308 = (fVar229 * fVar282 + fStack_4dc) * fVar166;
          fVar271 = local_318 * fVar314 - (local_348 * fVar302 + local_4d8);
          fVar307 = fStack_314 * fVar315 - (fStack_344 * fVar303 + fStack_4d4);
          fVar253 = fStack_310 * fVar316 - (fStack_340 * fVar305 + fStack_4d0);
          fVar256 = fStack_30c * fVar282 - (fStack_33c * fVar308 + fStack_4cc);
          fVar257 = local_478 * fVar314 - ((float)local_328._0_4_ * fVar302 + fVar317);
          fVar272 = fStack_474 * fVar315 - ((float)local_328._4_4_ * fVar303 + fVar318);
          fVar278 = fStack_470 * fVar316 - (fStack_320 * fVar305 + fVar319);
          fVar279 = fStack_46c * fVar282 - (fStack_31c * fVar308 + fVar320);
          local_508._4_4_ = fStack_544 * fVar315 - (fVar303 * (float)local_338._4_4_ + fVar280);
          local_508._0_4_ = local_548 * fVar314 - (fVar302 * (float)local_338._0_4_ + fVar296);
          fStack_500 = fStack_540 * fVar316 - (fVar305 * fStack_330 + fVar304);
          fStack_4fc = fStack_53c * fVar282 - (fVar308 * fStack_32c + fVar306);
          fVar155 = (fVar199 * fVar281 + local_4e8) * fVar155;
          fVar156 = (fVar200 * fVar290 + fStack_4e4) * fVar156;
          fVar157 = (fVar228 * fVar292 + fStack_4e0) * fVar157;
          fVar166 = (fVar229 * fVar294 + fStack_4dc) * fVar166;
          local_5a8._4_4_ = fStack_314 * fVar290 - (fStack_344 * fVar156 + fStack_4d4);
          local_5a8._0_4_ = local_318 * fVar281 - (local_348 * fVar155 + local_4d8);
          fStack_5a0 = fStack_310 * fVar292 - (fStack_340 * fVar157 + fStack_4d0);
          fStack_59c = fStack_30c * fVar294 - (fStack_33c * fVar166 + fStack_4cc);
          fVar199 = local_478 * fVar281 - ((float)local_328._0_4_ * fVar155 + fVar317);
          fVar200 = fStack_474 * fVar290 - ((float)local_328._4_4_ * fVar156 + fVar318);
          fVar228 = fStack_470 * fVar292 - (fStack_320 * fVar157 + fVar319);
          fVar229 = fStack_46c * fVar294 - (fStack_31c * fVar166 + fVar320);
          bVar25 = 0.0 <= auVar176._0_4_;
          uVar79 = -(uint)bVar25;
          bVar26 = 0.0 <= auVar176._4_4_;
          uVar81 = -(uint)bVar26;
          bVar27 = 0.0 <= auVar176._8_4_;
          uVar80 = -(uint)bVar27;
          bVar28 = 0.0 <= auVar176._12_4_;
          uVar82 = -(uint)bVar28;
          auVar192._0_4_ = local_548 * fVar281 - (fVar155 * (float)local_338._0_4_ + fVar296);
          auVar192._4_4_ = fStack_544 * fVar290 - (fVar156 * (float)local_338._4_4_ + fVar280);
          auVar192._8_4_ = fStack_540 * fVar292 - (fVar157 * fStack_330 + fVar304);
          auVar192._12_4_ = fStack_53c * fVar294 - (fVar166 * fStack_32c + fVar306);
          auVar235._0_4_ = (uint)fVar314 & uVar79;
          auVar235._4_4_ = (uint)fVar315 & uVar81;
          auVar235._8_4_ = (uint)fVar316 & uVar80;
          auVar235._12_4_ = (uint)fVar282 & uVar82;
          auVar177._0_8_ = CONCAT44(~uVar81,~uVar79) & 0x7f8000007f800000;
          auVar177._8_4_ = ~uVar80 & 0x7f800000;
          auVar177._12_4_ = ~uVar82 & 0x7f800000;
          auVar177 = auVar177 | auVar235;
          auVar248._0_4_ = (uint)fVar281 & uVar79;
          auVar248._4_4_ = (uint)fVar290 & uVar81;
          auVar248._8_4_ = (uint)fVar292 & uVar80;
          auVar248._12_4_ = (uint)fVar294 & uVar82;
          auVar147._0_8_ = CONCAT44(~uVar81,~uVar79) & 0xff800000ff800000;
          auVar147._8_4_ = ~uVar80 & 0xff800000;
          auVar147._12_4_ = ~uVar82 & 0xff800000;
          auVar147 = auVar147 | auVar248;
          auVar221._0_8_ = CONCAT44(fVar127,fVar84) & 0x7fffffff7fffffff;
          auVar221._8_4_ = ABS(fVar128);
          auVar221._12_4_ = ABS(fVar129);
          auVar39._4_4_ = fStack_2b4;
          auVar39._0_4_ = local_2b8;
          auVar39._8_4_ = fStack_2b0;
          auVar39._12_4_ = fStack_2ac;
          auVar159 = maxps(auVar39,auVar221);
          fVar84 = auVar159._0_4_ * 1.9073486e-06;
          fVar127 = auVar159._4_4_ * 1.9073486e-06;
          fVar128 = auVar159._8_4_ * 1.9073486e-06;
          fVar129 = auVar159._12_4_ * 1.9073486e-06;
          auVar222._0_4_ = -(uint)(ABS(fVar237) < fVar84 && bVar25);
          auVar222._4_4_ = -(uint)(ABS(fVar239) < fVar127 && bVar26);
          auVar222._8_4_ = -(uint)(ABS(fVar252) < fVar128 && bVar27);
          auVar222._12_4_ = -(uint)(ABS(fVar270) < fVar129 && bVar28);
          iVar63 = movmskps(iVar63,auVar222);
          if (iVar63 != 0) {
            uVar79 = -(uint)((float)local_538._0_4_ <= 0.0);
            uVar81 = -(uint)((float)local_538._4_4_ <= 0.0);
            uVar80 = -(uint)(fStack_530 <= 0.0);
            uVar82 = -(uint)(fStack_52c <= 0.0);
            auVar268._0_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar222._0_4_;
            auVar268._4_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar222._4_4_;
            auVar268._8_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar222._8_4_;
            auVar268._12_4_ = (uVar82 & 0xff800000 | ~uVar82 & 0x7f800000) & auVar222._12_4_;
            auVar249._0_4_ = ~auVar222._0_4_ & auVar177._0_4_;
            auVar249._4_4_ = ~auVar222._4_4_ & auVar177._4_4_;
            auVar249._8_4_ = ~auVar222._8_4_ & auVar177._8_4_;
            auVar249._12_4_ = ~auVar222._12_4_ & auVar177._12_4_;
            auVar269._0_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar222._0_4_;
            auVar269._4_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar222._4_4_;
            auVar269._8_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar222._8_4_;
            auVar269._12_4_ = (uVar82 & 0x7f800000 | ~uVar82 & 0xff800000) & auVar222._12_4_;
            auVar223._0_4_ = ~auVar222._0_4_ & auVar147._0_4_;
            auVar223._4_4_ = ~auVar222._4_4_ & auVar147._4_4_;
            auVar223._8_4_ = ~auVar222._8_4_ & auVar147._8_4_;
            auVar223._12_4_ = ~auVar222._12_4_ & auVar147._12_4_;
            local_488._4_4_ =
                 -(uint)((fVar127 <= ABS(fVar239) || (float)local_538._4_4_ <= 0.0) && bVar26);
            local_488._0_4_ =
                 -(uint)((fVar84 <= ABS(fVar237) || (float)local_538._0_4_ <= 0.0) && bVar25);
            fStack_480 = (float)-(uint)((fVar128 <= ABS(fVar252) || fStack_530 <= 0.0) && bVar27);
            fStack_47c = (float)-(uint)((fVar129 <= ABS(fVar270) || fStack_52c <= 0.0) && bVar28);
            auVar147 = auVar223 | auVar269;
            auVar177 = auVar249 | auVar268;
          }
        }
        fVar84 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar127 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar128 = (ray->super_RayK<1>).dir.field_0.m128[2];
        _local_138 = _local_458;
        local_128 = minps(auVar85,auVar177);
        _local_518 = maxps(_local_458,auVar147);
        _local_298 = _local_518;
        local_288 = auVar85;
        auVar236._0_4_ = -(uint)(fVar238 <= local_128._0_4_) & auVar312._0_4_;
        auVar236._4_4_ = -(uint)(fVar251 <= local_128._4_4_) & auVar312._4_4_;
        auVar236._8_4_ = -(uint)(fVar258 <= local_128._8_4_) & auVar312._8_4_;
        auVar236._12_4_ = -(uint)(fVar230 <= local_128._12_4_) & auVar312._12_4_;
        auVar113._0_8_ =
             CONCAT44(-(uint)((float)local_518._4_4_ <= auVar85._4_4_) & auVar312._4_4_,
                      -(uint)((float)local_518._0_4_ <= auVar85._0_4_) & auVar312._0_4_);
        auVar113._8_4_ = -(uint)(fStack_510 <= auVar85._8_4_) & auVar312._8_4_;
        auVar113._12_4_ = -(uint)(fStack_50c <= auVar85._12_4_) & auVar312._12_4_;
        auVar160._8_4_ = auVar113._8_4_;
        auVar160._0_8_ = auVar113._0_8_;
        auVar160._12_4_ = auVar113._12_4_;
        iVar63 = movmskps(iVar63,auVar160 | auVar236);
        if (iVar63 != 0) {
          _local_338 = auVar113;
          local_348 = fVar167;
          fStack_344 = fVar167;
          fStack_340 = fVar167;
          fStack_33c = fVar167;
          local_508._0_4_ =
               -(uint)((int)fVar167 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_508._0_4_ * fVar128 +
                                                 fVar257 * fVar127 + fVar271 * fVar84)) &
                             local_488._0_4_) << 0x1f) >> 0x1f) + 4);
          local_508._4_4_ =
               -(uint)((int)fVar167 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_508._4_4_ * fVar128 +
                                                 fVar272 * fVar127 + fVar307 * fVar84)) &
                             local_488._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_500 = (float)-(uint)((int)fVar167 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_500 * fVar128 +
                                                                fVar278 * fVar127 + fVar253 * fVar84
                                                               )) & (uint)fStack_480) << 0x1f) >>
                                     0x1f) + 4);
          fStack_4fc = (float)-(uint)((int)fVar167 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4fc * fVar128 +
                                                                fVar279 * fVar127 + fVar256 * fVar84
                                                               )) & (uint)fStack_47c) << 0x1f) >>
                                     0x1f) + 4);
          _local_328 = auVar236;
          local_2f8 = ~_local_508 & auVar236;
          iVar63 = movmskps(iVar63,local_2f8);
          if (iVar63 == 0) {
            fVar129 = (ray->super_RayK<1>).tfar;
            auVar250._4_4_ = fVar187;
            auVar250._0_4_ = fVar168;
            auVar250._8_4_ = fVar188;
            auVar250._12_4_ = fVar189;
            fVar155 = (float)local_518._0_4_;
            fVar156 = (float)local_518._4_4_;
            fVar157 = fStack_510;
            fVar166 = fStack_50c;
          }
          else {
            local_468 = local_4f8 + fVar238;
            fStack_464 = fStack_4f4 + fVar251;
            fStack_460 = fStack_4f0 + fVar258;
            fStack_45c = fStack_4ec + fVar230;
            auVar250._4_4_ = fVar187;
            auVar250._0_4_ = fVar168;
            auVar250._8_4_ = fVar188;
            auVar250._12_4_ = fVar189;
            do {
              auVar159 = ~local_2f8 & _DAT_01f7a9f0 | local_2f8 & _local_458;
              auVar178._4_4_ = auVar159._0_4_;
              auVar178._0_4_ = auVar159._4_4_;
              auVar178._8_4_ = auVar159._12_4_;
              auVar178._12_4_ = auVar159._8_4_;
              auVar85 = minps(auVar178,auVar159);
              auVar114._0_8_ = auVar85._8_8_;
              auVar114._8_4_ = auVar85._0_4_;
              auVar114._12_4_ = auVar85._4_4_;
              auVar85 = minps(auVar114,auVar85);
              auVar115._0_8_ =
                   CONCAT44(-(uint)(auVar85._4_4_ == auVar159._4_4_) & local_2f8._4_4_,
                            -(uint)(auVar85._0_4_ == auVar159._0_4_) & local_2f8._0_4_);
              auVar115._8_4_ = -(uint)(auVar85._8_4_ == auVar159._8_4_) & local_2f8._8_4_;
              auVar115._12_4_ = -(uint)(auVar85._12_4_ == auVar159._12_4_) & local_2f8._12_4_;
              iVar63 = movmskps(iVar63,auVar115);
              auVar148 = local_2f8;
              if (iVar63 != 0) {
                auVar148._8_4_ = auVar115._8_4_;
                auVar148._0_8_ = auVar115._0_8_;
                auVar148._12_4_ = auVar115._12_4_;
              }
              uVar64 = movmskps(iVar63,auVar148);
              pRVar68 = (RayHit *)0x0;
              if (CONCAT44(uVar69,uVar64) != 0) {
                for (; (CONCAT44(uVar69,uVar64) >> (long)pRVar68 & 1) == 0;
                    pRVar68 = (RayHit *)((long)(pRVar68->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_2f8 + (long)pRVar68 * 4) = 0;
              fVar129 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fVar155 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar156 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fVar157 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar31._4_4_ = fStack_4c4;
              auVar31._0_4_ = local_4c8;
              auVar31._8_4_ = fStack_4c0;
              auVar31._12_4_ = fStack_4bc;
              auVar159 = minps(_local_588,auVar31);
              auVar263 = maxps(_local_588,auVar31);
              auVar36._4_4_ = fStack_354;
              auVar36._0_4_ = local_358;
              auVar36._8_4_ = fStack_350;
              auVar36._12_4_ = fStack_34c;
              auVar85 = minps(auVar36,auVar250);
              auVar159 = minps(auVar159,auVar85);
              auVar85 = maxps(auVar36,auVar250);
              auVar85 = maxps(auVar263,auVar85);
              auVar161._0_8_ = auVar159._0_8_ & 0x7fffffff7fffffff;
              auVar161._8_4_ = auVar159._8_4_ & 0x7fffffff;
              auVar161._12_4_ = auVar159._12_4_ & 0x7fffffff;
              local_448 = auVar85._12_4_;
              auVar116._0_8_ = auVar85._0_8_ & 0x7fffffff7fffffff;
              auVar116._8_4_ = auVar85._8_4_ & 0x7fffffff;
              auVar116._12_4_ = ABS(local_448);
              auVar85 = maxps(auVar161,auVar116);
              fVar166 = auVar85._4_4_;
              if (auVar85._4_4_ <= auVar85._0_4_) {
                fVar166 = auVar85._0_4_;
              }
              auVar162._8_8_ = auVar85._8_8_;
              auVar162._0_8_ = auVar85._8_8_;
              if (auVar85._8_4_ <= fVar166) {
                auVar162._0_4_ = fVar166;
              }
              fVar237 = auVar162._0_4_ * 1.9073486e-06;
              local_3f8._0_4_ =
                   SQRT(fVar156 * fVar156 + fVar155 * fVar155 + fVar129 * fVar129) * 1.9073486e-06;
              fStack_444 = local_448;
              fStack_440 = local_448;
              fStack_43c = local_448;
              fVar166 = *(float *)(local_108 + (long)pRVar68 * 4);
              fVar230 = *(float *)(local_138 + (long)pRVar68 * 4);
              fVar238 = 0.0;
              fVar239 = 0.0;
              lVar76 = 5;
              do {
                fVar271 = 1.0 - fVar166;
                fVar307 = local_4c8 * fVar271 + local_358 * fVar166;
                fVar253 = fStack_4c4 * fVar271 + fStack_354 * fVar166;
                fVar257 = fStack_4c0 * fVar271 + fStack_350 * fVar166;
                fVar272 = fStack_4bc * fVar271 + fStack_34c * fVar166;
                fVar251 = ((float)local_588._0_4_ * fVar271 + local_4c8 * fVar166) * fVar271 +
                          fVar166 * fVar307;
                fVar252 = ((float)local_588._4_4_ * fVar271 + fStack_4c4 * fVar166) * fVar271 +
                          fVar166 * fVar253;
                fVar258 = (fStack_580 * fVar271 + fStack_4c0 * fVar166) * fVar271 +
                          fVar166 * fVar257;
                fVar270 = (fStack_57c * fVar271 + fStack_4bc * fVar166) * fVar271 +
                          fVar166 * fVar272;
                fVar307 = fVar307 * fVar271 + (local_358 * fVar271 + fVar168 * fVar166) * fVar166;
                fVar256 = fVar253 * fVar271 + (fStack_354 * fVar271 + fVar187 * fVar166) * fVar166;
                fVar257 = fVar257 * fVar271 + (fStack_350 * fVar271 + fVar188 * fVar166) * fVar166;
                fVar272 = fVar272 * fVar271 + (fStack_34c * fVar271 + fVar189 * fVar166) * fVar166;
                local_3a8 = fVar271 * fVar251 + fVar166 * fVar307;
                fStack_3a4 = fVar271 * fVar252 + fVar166 * fVar256;
                fStack_3a0 = fVar271 * fVar258 + fVar166 * fVar257;
                fStack_39c = fVar271 * fVar270 + fVar166 * fVar272;
                fVar253 = (fVar307 - fVar251) * 3.0;
                fVar256 = (fVar256 - fVar252) * 3.0;
                fVar257 = (fVar257 - fVar258) * 3.0;
                fVar272 = (fVar272 - fVar270) * 3.0;
                fVar270 = fVar271 * 6.0;
                fVar252 = (fVar166 - (fVar271 + fVar271)) * 6.0;
                fVar258 = (fVar271 - (fVar166 + fVar166)) * 6.0;
                fVar251 = fVar166 * 6.0;
                fVar271 = fVar270 * (float)local_588._0_4_ +
                          fVar252 * local_4c8 + fVar258 * local_358 + fVar251 * fVar168;
                fVar307 = fVar270 * (float)local_588._4_4_ +
                          fVar252 * fStack_4c4 + fVar258 * fStack_354 + fVar251 * fVar187;
                fVar252 = fVar270 * fStack_580 +
                          fVar252 * fStack_4c0 + fVar258 * fStack_350 + fVar251 * fVar188;
                local_418 = (fVar230 * fVar129 + 0.0) - local_3a8;
                fStack_414 = (fVar230 * fVar155 + 0.0) - fStack_3a4;
                fStack_410 = (fVar230 * fVar156 + 0.0) - fStack_3a0;
                fStack_40c = (fVar230 * fVar157 + 0.0) - fStack_39c;
                fVar251 = fStack_414 * fStack_414;
                fStack_400 = fStack_410 * fStack_410;
                fStack_3fc = fStack_40c * fStack_40c;
                local_408 = fVar251 + local_418 * local_418 + fStack_400;
                fStack_404 = fVar251 + fVar251 + fStack_3fc;
                fStack_400 = fVar251 + fStack_400 + fStack_400;
                fStack_3fc = fVar251 + fStack_3fc + fStack_3fc;
                uStack_5c4 = auVar162._4_4_;
                uStack_5c0 = auVar162._8_4_;
                uStack_5bc = auVar162._12_4_;
                local_3e8._0_4_ = fVar237;
                if (fVar237 <= (float)local_3f8._0_4_ * fVar230) {
                  local_3e8._0_4_ = (float)local_3f8._0_4_ * fVar230;
                }
                fVar270 = fVar256 * fVar256 + fVar253 * fVar253 + fVar257 * fVar257;
                auVar159 = ZEXT416((uint)fVar270);
                auVar85 = rsqrtss(ZEXT416((uint)fVar270),auVar159);
                fVar251 = auVar85._0_4_;
                fVar279 = fVar251 * 1.5 - fVar251 * fVar251 * fVar270 * 0.5 * fVar251;
                fVar292 = fVar253 * fVar279;
                fVar294 = fVar256 * fVar279;
                fVar296 = fVar257 * fVar279;
                local_3d8._4_4_ = fVar272 * fVar279;
                fVar302 = fVar257 * fVar252 + fVar256 * fVar307 + fVar253 * fVar271;
                auVar85 = rcpss(auVar159,auVar159);
                fVar258 = (2.0 - fVar270 * auVar85._0_4_) * auVar85._0_4_;
                fVar278 = fStack_414 * fVar294;
                fVar281 = fStack_410 * fVar296;
                fVar290 = fStack_40c * (float)local_3d8._4_4_;
                fVar251 = fVar278 + local_418 * fVar292 + fVar281;
                fVar303 = fVar278 + fVar278 + fVar290;
                fVar281 = fVar278 + fVar281 + fVar281;
                fVar290 = fVar278 + fVar290 + fVar290;
                local_3e8._4_4_ = uStack_5c4;
                local_3e8._8_4_ = uStack_5c0;
                local_3e8._12_4_ = uStack_5bc;
                local_3b8 = (SQRT(local_408) + 1.0) * (fVar237 / SQRT(fVar270)) +
                            SQRT(local_408) * fVar237 + (float)local_3e8._0_4_;
                fVar278 = fVar157 * (float)local_3d8._4_4_;
                fStack_3d0 = fVar296 * -fVar257;
                local_3d8._4_4_ = (float)local_3d8._4_4_ * -fVar272;
                local_3d8._0_4_ =
                     fStack_3d0 + fVar294 * -fVar256 + fVar292 * -fVar253 +
                     fVar258 * (fVar270 * fVar252 - fVar302 * fVar257) * fVar279 * fStack_410 +
                     fVar258 * (fVar270 * fVar307 - fVar302 * fVar256) * fVar279 * fStack_414 +
                     fVar258 * (fVar270 * fVar271 - fVar302 * fVar253) * fVar279 * local_418;
                fVar270 = fVar156 * fVar296 + fVar155 * fVar294 + fVar129 * fVar292;
                fVar271 = local_408 - fVar251 * fVar251;
                auVar117._0_8_ = CONCAT44(fStack_404 - fVar303 * fVar303,fVar271);
                auVar117._8_4_ = fStack_400 - fVar281 * fVar281;
                auVar117._12_4_ = fStack_3fc - fVar290 * fVar290;
                fStack_3c0 = -fVar257 * fStack_410;
                fStack_3c4 = -fVar272 * fStack_40c;
                fStack_3cc = (float)local_3d8._4_4_;
                local_3c8 = (fStack_3c0 + -fVar256 * fStack_414 + -fVar253 * local_418) -
                            fVar251 * (float)local_3d8._0_4_;
                fStack_3bc = fStack_3c4;
                fVar258 = fVar157 * fStack_40c;
                fVar252 = (fVar156 * fStack_410 + fVar155 * fStack_414 + fVar129 * local_418) -
                          fVar251 * fVar270;
                auVar149._8_4_ = auVar117._8_4_;
                auVar149._0_8_ = auVar117._0_8_;
                auVar149._12_4_ = auVar117._12_4_;
                auVar85 = rsqrtss(auVar149,auVar117);
                fVar307 = auVar85._0_4_;
                auVar179._0_4_ = fVar307 * 1.5 - fVar307 * fVar307 * fVar271 * 0.5 * fVar307;
                auVar179._4_12_ = auVar85._4_12_;
                local_4d8 = fVar230;
                fStack_4d4 = fVar166;
                fStack_4d0 = fVar238;
                fStack_4cc = fVar239;
                if (fVar271 < 0.0) {
                  _local_538 = auVar179;
                  local_4e8 = fVar252;
                  fStack_4e4 = fVar258;
                  fStack_4e0 = fVar156 * fStack_410;
                  fStack_4dc = fVar258;
                  local_438 = fVar270;
                  fStack_434 = fVar278;
                  fStack_430 = fVar156 * fVar296;
                  fStack_42c = fVar278;
                  local_428 = fVar251;
                  fStack_424 = fVar303;
                  fStack_420 = fVar281;
                  fStack_41c = fVar290;
                  fVar271 = sqrtf(fVar271);
                  pRVar68 = extraout_RAX;
                  auVar179 = _local_538;
                  fVar251 = local_428;
                  fVar252 = local_4e8;
                  fVar258 = fStack_4e4;
                  fVar270 = local_438;
                  fVar278 = fStack_434;
                }
                else {
                  fVar271 = SQRT(fVar271);
                }
                fVar271 = fVar271 - fStack_39c;
                fVar166 = local_3c8 * auVar179._0_4_ - fVar272;
                fVar252 = fVar252 * auVar179._0_4_;
                auVar225._0_8_ = local_3d8;
                auVar180._0_4_ = local_3d8._0_4_ * fVar252 - fVar270 * fVar166;
                auVar194._8_4_ = -fStack_3c4;
                auVar194._0_8_ = CONCAT44(fStack_3c4,fVar166) ^ 0x8000000000000000;
                auVar194._12_4_ = fVar258;
                auVar193._8_8_ = auVar194._8_8_;
                auVar193._0_8_ = CONCAT44(fVar252,fVar166) ^ 0x80000000;
                auVar180._4_4_ = auVar180._0_4_;
                auVar180._8_4_ = auVar180._0_4_;
                auVar180._12_4_ = auVar180._0_4_;
                auVar85 = divps(auVar193,auVar180);
                auVar225._8_4_ = local_3d8._4_4_;
                auVar225._12_4_ = -fVar278;
                auVar224._8_8_ = auVar225._8_8_;
                auVar224._0_8_ = CONCAT44(fVar270,local_3d8._0_4_) ^ 0x8000000000000000;
                auVar159 = divps(auVar224,auVar180);
                fVar230 = local_4d8 - (fVar271 * auVar159._0_4_ + fVar251 * auVar85._0_4_);
                fVar166 = fStack_4d4 - (fVar271 * auVar159._4_4_ + fVar251 * auVar85._4_4_);
                fVar238 = fStack_4d0 - (fVar271 * auVar159._8_4_ + fVar251 * auVar85._8_4_);
                fVar239 = fStack_4cc - (fVar271 * auVar159._12_4_ + fVar251 * auVar85._12_4_);
                if ((ABS(fVar251) < local_3b8) &&
                   (ABS(fVar271) < local_448 * 1.9073486e-06 + (float)local_3e8._0_4_ + local_3b8))
                {
                  fVar230 = local_308._0_4_ + fVar230;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar230) &&
                     (((fVar129 = (ray->super_RayK<1>).tfar, fVar230 <= fVar129 && (0.0 <= fVar166))
                      && (fVar166 <= 1.0)))) {
                    auVar34._4_4_ = fStack_404;
                    auVar34._0_4_ = local_408;
                    auVar34._8_4_ = fStack_400;
                    auVar34._12_4_ = fStack_3fc;
                    auVar85 = rsqrtss(auVar34,auVar34);
                    fVar155 = auVar85._0_4_;
                    pGVar19 = (context->scene->geometries).items[(long)pRVar71].ptr;
                    uVar79 = (ray->super_RayK<1>).mask;
                    pRVar68 = (RayHit *)(ulong)uVar79;
                    pRVar70 = pRVar71;
                    if ((pGVar19->mask & uVar79) != 0) {
                      fVar237 = fVar155 * 1.5 + fVar155 * fVar155 * local_408 * -0.5 * fVar155;
                      fVar238 = local_418 * fVar237;
                      fVar251 = fStack_414 * fVar237;
                      fVar237 = fStack_410 * fVar237;
                      fVar155 = fVar272 * fVar238 + fVar253;
                      fVar156 = fVar272 * fVar251 + fVar256;
                      fVar157 = fVar272 * fVar237 + fVar257;
                      fVar239 = fVar251 * fVar253 - fVar256 * fVar238;
                      fVar251 = fVar237 * fVar256 - fVar257 * fVar251;
                      fVar238 = fVar238 * fVar257 - fVar253 * fVar237;
                      fVar237 = fVar156 * fVar251 - fVar238 * fVar155;
                      fVar156 = fVar157 * fVar238 - fVar239 * fVar156;
                      fVar155 = fVar155 * fVar239 - fVar251 * fVar157;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar230;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar155,fVar156);
                        (ray->Ng).field_0.field_0.z = fVar237;
                        ray->u = fVar166;
                        ray->v = 0.0;
                        ray->primID = uVar78;
                        ray->geomID = uVar77;
                        ray->instID[0] = context->user->instID[0];
                        uVar79 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar79;
                        pRVar68 = (RayHit *)(ulong)uVar79;
                      }
                      else {
                        local_4b8 = CONCAT44(fVar155,fVar156);
                        fStack_4b0 = fVar237;
                        fStack_4ac = fVar166;
                        local_4a8 = 0;
                        local_4a4 = uVar78;
                        local_4a0 = uVar77;
                        local_49c = context->user->instID[0];
                        pRVar70 = (RTCIntersectArguments *)(ulong)local_49c;
                        local_498 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar230;
                        local_398._0_4_ = 0xffffffff;
                        local_578.geometryUserPtr = pGVar19->userPtr;
                        local_578.valid = (int *)local_398;
                        local_578.context = context->user;
                        local_578.hit = (RTCHitN *)&local_4b8;
                        local_578.N = 1;
                        local_578.ray = (RTCRayN *)ray;
                        if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b19acc:
                          pRVar70 = context->args;
                          if ((pRVar70->filter != (RTCFilterFunctionN)0x0) &&
                             (((pRVar70->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            (*pRVar70->filter)(&local_578);
                            if ((((RayK<1> *)local_578.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00b19b61;
                          }
                          (((Vec3f *)((long)local_578.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_578.hit;
                          (((Vec3f *)((long)local_578.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_578.hit + 4);
                          (((Vec3f *)((long)local_578.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_578.hit + 8);
                          *(float *)((long)local_578.ray + 0x3c) = *(float *)(local_578.hit + 0xc);
                          *(float *)((long)local_578.ray + 0x40) = *(float *)(local_578.hit + 0x10);
                          *(float *)((long)local_578.ray + 0x44) = *(float *)(local_578.hit + 0x14);
                          *(float *)((long)local_578.ray + 0x48) = *(float *)(local_578.hit + 0x18);
                          *(float *)((long)local_578.ray + 0x4c) = *(float *)(local_578.hit + 0x1c);
                          pRVar70 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_578.hit + 0x20);
                          *(float *)((long)local_578.ray + 0x50) = *(float *)(local_578.hit + 0x20);
                          pRVar68 = (RayHit *)local_578.ray;
                        }
                        else {
                          (*pGVar19->intersectionFilterN)(&local_578);
                          if ((((RayK<1> *)local_578.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00b19acc;
LAB_00b19b61:
                          (ray->super_RayK<1>).tfar = fVar129;
                          pRVar68 = (RayHit *)local_578.valid;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar76 = lVar76 + -1;
              } while (lVar76 != 0);
              fVar129 = (ray->super_RayK<1>).tfar;
              local_2f8._0_4_ = -(uint)(local_468 <= fVar129) & local_2f8._0_4_;
              local_2f8._4_4_ = -(uint)(fStack_464 <= fVar129) & local_2f8._4_4_;
              local_2f8._8_4_ = -(uint)(fStack_460 <= fVar129) & local_2f8._8_4_;
              local_2f8._12_4_ = -(uint)(fStack_45c <= fVar129) & local_2f8._12_4_;
              uVar69 = (undefined4)((ulong)pRVar68 >> 0x20);
              iVar63 = movmskps((int)pRVar68,local_2f8);
            } while (iVar63 != 0);
            fVar155 = (float)local_298._0_4_;
            fVar156 = (float)local_298._4_4_;
            fVar157 = fStack_290;
            fVar166 = fStack_28c;
          }
          uVar64 = SUB84(pRVar70,0);
          local_518._0_4_ = -(uint)((float)local_518._0_4_ + local_4f8 <= fVar129) & local_338._0_4_
          ;
          local_518._4_4_ =
               -(uint)((float)local_518._4_4_ + fStack_4f4 <= fVar129) & local_338._4_4_;
          fStack_510 = (float)(-(uint)(fStack_510 + fStack_4f0 <= fVar129) & (uint)fStack_330);
          fStack_50c = (float)(-(uint)(fStack_50c + fStack_4ec <= fVar129) & (uint)fStack_32c);
          auVar151._0_4_ =
               -(uint)((int)local_348 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5a8._0_4_ * fVar84 +
                                                 fVar199 * fVar127 + auVar192._0_4_ * fVar128)) &
                             local_488._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar151._4_4_ =
               -(uint)((int)fStack_344 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5a8._4_4_ * fVar84 +
                                                 fVar200 * fVar127 + auVar192._4_4_ * fVar128)) &
                             local_488._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar151._8_4_ =
               -(uint)((int)fStack_340 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_5a0 * fVar84 +
                                                 fVar228 * fVar127 + auVar192._8_4_ * fVar128)) &
                             (uint)fStack_480) << 0x1f) >> 0x1f) + 4);
          auVar151._12_4_ =
               -(uint)((int)fStack_33c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_59c * fVar84 +
                                                 fVar229 * fVar127 + auVar192._12_4_ * fVar128)) &
                             (uint)fStack_47c) << 0x1f) >> 0x1f) + 4);
          local_398 = ~auVar151 & _local_518;
          iVar63 = movmskps(0,local_398);
          if (iVar63 != 0) {
            local_468 = local_4f8 + fVar155;
            fStack_464 = fStack_4f4 + fVar156;
            fStack_460 = fStack_4f0 + fVar157;
            fStack_45c = fStack_4ec + fVar166;
            local_458._4_4_ = fVar156;
            local_458._0_4_ = fVar155;
            fStack_450 = fVar157;
            fStack_44c = fVar166;
            do {
              uVar79 = local_398._0_4_;
              uVar81 = local_398._4_4_;
              uVar80 = local_398._8_4_;
              uVar82 = local_398._12_4_;
              auVar120._0_4_ = uVar79 & (uint)fVar155;
              auVar120._4_4_ = uVar81 & (uint)fVar156;
              auVar120._8_4_ = uVar80 & (uint)fVar157;
              auVar120._12_4_ = uVar82 & (uint)fVar166;
              auVar165._0_8_ = CONCAT44(~uVar81,~uVar79) & 0x7f8000007f800000;
              auVar165._8_4_ = ~uVar80 & 0x7f800000;
              auVar165._12_4_ = ~uVar82 & 0x7f800000;
              auVar165 = auVar165 | auVar120;
              auVar182._4_4_ = auVar165._0_4_;
              auVar182._0_4_ = auVar165._4_4_;
              auVar182._8_4_ = auVar165._12_4_;
              auVar182._12_4_ = auVar165._8_4_;
              auVar85 = minps(auVar182,auVar165);
              auVar121._0_8_ = auVar85._8_8_;
              auVar121._8_4_ = auVar85._0_4_;
              auVar121._12_4_ = auVar85._4_4_;
              auVar85 = minps(auVar121,auVar85);
              auVar122._0_8_ =
                   CONCAT44(-(uint)(auVar85._4_4_ == auVar165._4_4_) & uVar81,
                            -(uint)(auVar85._0_4_ == auVar165._0_4_) & uVar79);
              auVar122._8_4_ = -(uint)(auVar85._8_4_ == auVar165._8_4_) & uVar80;
              auVar122._12_4_ = -(uint)(auVar85._12_4_ == auVar165._12_4_) & uVar82;
              iVar63 = movmskps(iVar63,auVar122);
              auVar152 = local_398;
              if (iVar63 != 0) {
                auVar152._8_4_ = auVar122._8_4_;
                auVar152._0_8_ = auVar122._0_8_;
                auVar152._12_4_ = auVar122._12_4_;
              }
              uVar64 = movmskps(iVar63,auVar152);
              pRVar68 = (RayHit *)0x0;
              if (CONCAT44(uVar69,uVar64) != 0) {
                for (; (CONCAT44(uVar69,uVar64) >> (long)pRVar68 & 1) == 0;
                    pRVar68 = (RayHit *)((long)(pRVar68->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_398 + (long)pRVar68 * 4) = 0;
              fVar84 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fVar127 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar128 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fVar129 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar32._4_4_ = fStack_4c4;
              auVar32._0_4_ = local_4c8;
              auVar32._8_4_ = fStack_4c0;
              auVar32._12_4_ = fStack_4bc;
              auVar159 = minps(_local_588,auVar32);
              auVar263 = maxps(_local_588,auVar32);
              auVar37._4_4_ = fStack_354;
              auVar37._0_4_ = local_358;
              auVar37._8_4_ = fStack_350;
              auVar37._12_4_ = fStack_34c;
              auVar85 = minps(auVar37,auVar250);
              auVar159 = minps(auVar159,auVar85);
              auVar85 = maxps(auVar37,auVar250);
              auVar85 = maxps(auVar263,auVar85);
              auVar183._0_8_ = auVar159._0_8_ & 0x7fffffff7fffffff;
              auVar183._8_4_ = auVar159._8_4_ & 0x7fffffff;
              auVar183._12_4_ = auVar159._12_4_ & 0x7fffffff;
              local_448 = auVar85._12_4_;
              auVar123._0_8_ = auVar85._0_8_ & 0x7fffffff7fffffff;
              auVar123._8_4_ = auVar85._8_4_ & 0x7fffffff;
              auVar123._12_4_ = ABS(local_448);
              auVar85 = maxps(auVar183,auVar123);
              fVar155 = auVar85._4_4_;
              if (auVar85._4_4_ <= auVar85._0_4_) {
                fVar155 = auVar85._0_4_;
              }
              auVar184._8_8_ = auVar85._8_8_;
              auVar184._0_8_ = auVar85._8_8_;
              if (auVar85._8_4_ <= fVar155) {
                auVar184._0_4_ = fVar155;
              }
              local_3f8._4_12_ = auVar184._4_12_;
              local_3f8._0_4_ = auVar184._0_4_ * 1.9073486e-06;
              local_3e8._0_4_ =
                   SQRT(fVar128 * fVar128 + fVar127 * fVar127 + fVar84 * fVar84) * 1.9073486e-06;
              fStack_444 = local_448;
              fStack_440 = local_448;
              fStack_43c = local_448;
              fVar155 = local_118[(long)pRVar68];
              fVar156 = *(float *)(local_288 + (long)pRVar68 * 4);
              lVar76 = 5;
              do {
                fVar157 = 1.0 - fVar155;
                fVar199 = local_4c8 * fVar157 + local_358 * fVar155;
                fVar200 = fStack_4c4 * fVar157 + fStack_354 * fVar155;
                fVar228 = fStack_4c0 * fVar157 + fStack_350 * fVar155;
                fVar230 = fStack_4bc * fVar157 + fStack_34c * fVar155;
                fVar229 = ((float)local_588._0_4_ * fVar157 + local_4c8 * fVar155) * fVar157 +
                          fVar155 * fVar199;
                fVar237 = ((float)local_588._4_4_ * fVar157 + fStack_4c4 * fVar155) * fVar157 +
                          fVar155 * fVar200;
                fVar238 = (fStack_580 * fVar157 + fStack_4c0 * fVar155) * fVar157 +
                          fVar155 * fVar228;
                fVar166 = (fStack_57c * fVar157 + fStack_4bc * fVar155) * fVar157 +
                          fVar155 * fVar230;
                fVar251 = fVar199 * fVar157 +
                          (local_358 * fVar157 + auVar250._0_4_ * fVar155) * fVar155;
                fVar252 = fVar200 * fVar157 +
                          (fStack_354 * fVar157 + auVar250._4_4_ * fVar155) * fVar155;
                fVar258 = fVar228 * fVar157 +
                          (fStack_350 * fVar157 + auVar250._8_4_ * fVar155) * fVar155;
                fVar199 = fVar230 * fVar157 +
                          (fStack_34c * fVar157 + auVar250._12_4_ * fVar155) * fVar155;
                fVar270 = fVar157 * fVar166 + fVar155 * fVar199;
                local_4d8 = (fVar251 - fVar229) * 3.0;
                fStack_4d4 = (fVar252 - fVar237) * 3.0;
                fStack_4d0 = (fVar258 - fVar238) * 3.0;
                fStack_4cc = (fVar199 - fVar166) * 3.0;
                fVar166 = fVar157 * 6.0;
                fVar230 = (fVar155 - (fVar157 + fVar157)) * 6.0;
                fVar239 = (fVar157 - (fVar155 + fVar155)) * 6.0;
                fVar228 = fVar155 * 6.0;
                fVar199 = fVar166 * (float)local_588._0_4_ +
                          fVar230 * local_4c8 + fVar239 * local_358 + fVar228 * auVar250._0_4_;
                fVar200 = fVar166 * (float)local_588._4_4_ +
                          fVar230 * fStack_4c4 + fVar239 * fStack_354 + fVar228 * auVar250._4_4_;
                fVar166 = fVar166 * fStack_580 +
                          fVar230 * fStack_4c0 + fVar239 * fStack_350 + fVar228 * auVar250._8_4_;
                local_418 = (fVar156 * fVar84 + 0.0) - (fVar157 * fVar229 + fVar155 * fVar251);
                fStack_414 = (fVar156 * fVar127 + 0.0) - (fVar157 * fVar237 + fVar155 * fVar252);
                fStack_410 = (fVar156 * fVar128 + 0.0) - (fVar157 * fVar238 + fVar155 * fVar258);
                fStack_40c = (fVar156 * fVar129 + 0.0) - fVar270;
                fVar157 = fStack_414 * fStack_414;
                fStack_400 = fStack_410 * fStack_410;
                fStack_3fc = fStack_40c * fStack_40c;
                local_408 = fVar157 + local_418 * local_418 + fStack_400;
                fStack_404 = fVar157 + fVar157 + fStack_3fc;
                fStack_400 = fVar157 + fStack_400 + fStack_400;
                fStack_3fc = fVar157 + fStack_3fc + fStack_3fc;
                local_3d8._0_4_ = local_3f8._0_4_;
                if ((float)local_3f8._0_4_ <= (float)local_3e8._0_4_ * fVar156) {
                  local_3d8._0_4_ = (float)local_3e8._0_4_ * fVar156;
                }
                fVar230 = fStack_4d4 * fStack_4d4 + local_4d8 * local_4d8 + fStack_4d0 * fStack_4d0;
                auVar159 = ZEXT416((uint)fVar230);
                auVar85 = rsqrtss(ZEXT416((uint)fVar230),auVar159);
                fVar157 = auVar85._0_4_;
                fVar237 = fVar157 * 1.5 - fVar157 * fVar157 * fVar230 * 0.5 * fVar157;
                fVar251 = local_4d8 * fVar237;
                fVar252 = fStack_4d4 * fVar237;
                fVar258 = fStack_4d0 * fVar237;
                fStack_3c4 = fStack_4cc * fVar237;
                fVar271 = fStack_4d0 * fVar166 + fStack_4d4 * fVar200 + local_4d8 * fVar199;
                auVar85 = rcpss(auVar159,auVar159);
                fVar229 = (2.0 - fVar230 * auVar85._0_4_) * auVar85._0_4_;
                fVar228 = fStack_414 * fVar252;
                fVar238 = fStack_410 * fVar258;
                fVar239 = fStack_40c * fStack_3c4;
                fVar157 = fVar228 + local_418 * fVar251 + fVar238;
                fVar307 = fVar228 + fVar228 + fVar239;
                fVar238 = fVar228 + fVar238 + fVar238;
                fVar239 = fVar228 + fVar239 + fVar239;
                local_3d8._4_4_ = local_3f8._4_4_;
                fStack_3d0 = (float)local_3f8._8_4_;
                fStack_3cc = (float)local_3f8._12_4_;
                local_3a8 = (SQRT(local_408) + 1.0) * ((float)local_3f8._0_4_ / SQRT(fVar230)) +
                            SQRT(local_408) * (float)local_3f8._0_4_ + (float)local_3d8._0_4_;
                fVar228 = fVar129 * fStack_3c4;
                fStack_3c0 = fVar258 * -fStack_4d0;
                fStack_3c4 = fStack_3c4 * -fStack_4cc;
                local_3c8 = fStack_3c0 + fVar252 * -fStack_4d4 + fVar251 * -local_4d8 +
                            fVar229 * (fVar230 * fVar166 - fVar271 * fStack_4d0) * fVar237 *
                            fStack_410 +
                            fVar229 * (fVar230 * fVar200 - fVar271 * fStack_4d4) * fVar237 *
                            fStack_414 +
                            fVar229 * (fVar230 * fVar199 - fVar271 * local_4d8) * fVar237 *
                            local_418;
                fVar200 = fVar128 * fVar258 + fVar127 * fVar252 + fVar84 * fVar251;
                fVar229 = local_408 - fVar157 * fVar157;
                auVar313._0_8_ = CONCAT44(fStack_404 - fVar307 * fVar307,fVar229);
                auVar313._8_4_ = fStack_400 - fVar238 * fVar238;
                auVar313._12_4_ = fStack_3fc - fVar239 * fVar239;
                fStack_3b0 = -fStack_4d0 * fStack_410;
                fStack_3b4 = -fStack_4cc * fStack_40c;
                fStack_3bc = fStack_3c4;
                local_3b8 = (fStack_3b0 + -fStack_4d4 * fStack_414 + -local_4d8 * local_418) -
                            fVar157 * local_3c8;
                fStack_3ac = fStack_3b4;
                fVar199 = fVar129 * fStack_40c;
                fVar166 = (fVar128 * fStack_410 + fVar127 * fStack_414 + fVar84 * local_418) -
                          fVar157 * fVar200;
                auVar153._8_4_ = auVar313._8_4_;
                auVar153._0_8_ = auVar313._0_8_;
                auVar153._12_4_ = auVar313._12_4_;
                auVar85 = rsqrtss(auVar153,auVar313);
                fVar230 = auVar85._0_4_;
                auVar185._0_4_ = fVar230 * 1.5 - fVar230 * fVar230 * fVar229 * 0.5 * fVar230;
                auVar185._4_12_ = auVar85._4_12_;
                if (fVar229 < 0.0) {
                  _local_538 = auVar185;
                  local_4e8 = fVar166;
                  fStack_4e4 = fVar199;
                  fStack_4e0 = fVar128 * fStack_410;
                  fStack_4dc = fVar199;
                  local_438 = fVar200;
                  fStack_434 = fVar228;
                  fStack_430 = fVar128 * fVar258;
                  fStack_42c = fVar228;
                  local_428 = fVar157;
                  fStack_424 = fVar307;
                  fStack_420 = fVar238;
                  fStack_41c = fVar239;
                  fVar229 = sqrtf(fVar229);
                  pRVar68 = extraout_RAX_00;
                  auVar185 = _local_538;
                  fVar157 = local_428;
                  fVar166 = local_4e8;
                  fVar199 = fStack_4e4;
                  fVar200 = local_438;
                  fVar228 = fStack_434;
                }
                else {
                  fVar229 = SQRT(fVar229);
                }
                auVar250._4_4_ = fVar187;
                auVar250._0_4_ = fVar168;
                auVar250._8_4_ = fVar188;
                auVar250._12_4_ = fVar189;
                fVar229 = fVar229 - fVar270;
                fVar230 = local_3b8 * auVar185._0_4_ - fStack_4cc;
                fVar166 = fVar166 * auVar185._0_4_;
                auVar227._4_4_ = fStack_3c4;
                auVar227._0_4_ = local_3c8;
                auVar186._0_4_ = local_3c8 * fVar166 - fVar200 * fVar230;
                auVar196._8_4_ = -fStack_3b4;
                auVar196._0_8_ = CONCAT44(fStack_3b4,fVar230) ^ 0x8000000000000000;
                auVar196._12_4_ = fVar199;
                auVar195._8_8_ = auVar196._8_8_;
                auVar195._0_8_ = CONCAT44(fVar166,fVar230) ^ 0x80000000;
                auVar186._4_4_ = auVar186._0_4_;
                auVar186._8_4_ = auVar186._0_4_;
                auVar186._12_4_ = auVar186._0_4_;
                auVar85 = divps(auVar195,auVar186);
                auVar227._8_4_ = fStack_3c4;
                auVar227._12_4_ = -fVar228;
                auVar226._8_8_ = auVar227._8_8_;
                auVar226._0_8_ = CONCAT44(fVar200,local_3c8) ^ 0x8000000000000000;
                auVar159 = divps(auVar226,auVar186);
                fVar156 = fVar156 - (fVar229 * auVar159._0_4_ + fVar157 * auVar85._0_4_);
                fVar155 = fVar155 - (fVar229 * auVar159._4_4_ + fVar157 * auVar85._4_4_);
                if ((ABS(fVar157) < local_3a8) &&
                   (ABS(fVar229) < local_448 * 1.9073486e-06 + (float)local_3d8._0_4_ + local_3a8))
                {
                  fVar156 = local_308._0_4_ + fVar156;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar156) &&
                     (((fVar84 = (ray->super_RayK<1>).tfar, fVar156 <= fVar84 && (0.0 <= fVar155))
                      && (fVar155 <= 1.0)))) {
                    auVar35._4_4_ = fStack_404;
                    auVar35._0_4_ = local_408;
                    auVar35._8_4_ = fStack_400;
                    auVar35._12_4_ = fStack_3fc;
                    auVar85 = rsqrtss(auVar35,auVar35);
                    fVar127 = auVar85._0_4_;
                    pGVar19 = (context->scene->geometries).items[(long)pRVar71].ptr;
                    uVar79 = (ray->super_RayK<1>).mask;
                    pRVar68 = (RayHit *)(ulong)uVar79;
                    pRVar70 = pRVar71;
                    if ((pGVar19->mask & uVar79) != 0) {
                      fVar157 = fVar127 * 1.5 + fVar127 * fVar127 * local_408 * -0.5 * fVar127;
                      fVar166 = local_418 * fVar157;
                      fVar200 = fStack_414 * fVar157;
                      fVar157 = fStack_410 * fVar157;
                      fVar127 = fStack_4cc * fVar166 + local_4d8;
                      fVar128 = fStack_4cc * fVar200 + fStack_4d4;
                      fVar129 = fStack_4cc * fVar157 + fStack_4d0;
                      fVar199 = fVar200 * local_4d8 - fStack_4d4 * fVar166;
                      fVar200 = fVar157 * fStack_4d4 - fStack_4d0 * fVar200;
                      fVar166 = fVar166 * fStack_4d0 - local_4d8 * fVar157;
                      fVar157 = fVar128 * fVar200 - fVar166 * fVar127;
                      fVar128 = fVar129 * fVar166 - fVar199 * fVar128;
                      fVar127 = fVar127 * fVar199 - fVar200 * fVar129;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar156;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar127,fVar128);
                        (ray->Ng).field_0.field_0.z = fVar157;
                        ray->u = fVar155;
                        ray->v = 0.0;
                        ray->primID = uVar78;
                        ray->geomID = uVar77;
                        ray->instID[0] = context->user->instID[0];
                        uVar79 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar79;
                        pRVar68 = (RayHit *)(ulong)uVar79;
                      }
                      else {
                        local_4b8 = CONCAT44(fVar127,fVar128);
                        fStack_4b0 = fVar157;
                        fStack_4ac = fVar155;
                        local_4a8 = 0;
                        local_4a4 = uVar78;
                        local_4a0 = uVar77;
                        local_49c = context->user->instID[0];
                        pRVar70 = (RTCIntersectArguments *)(ulong)local_49c;
                        local_498 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar156;
                        local_51c = 0xffffffff;
                        local_578.geometryUserPtr = pGVar19->userPtr;
                        local_578.valid = &local_51c;
                        local_578.context = context->user;
                        local_578.hit = (RTCHitN *)&local_4b8;
                        local_578.N = 1;
                        local_578.ray = (RTCRayN *)ray;
                        if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b1a598:
                          pRVar70 = context->args;
                          if ((pRVar70->filter != (RTCFilterFunctionN)0x0) &&
                             (((pRVar70->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            (*pRVar70->filter)(&local_578);
                            if ((((RayK<1> *)local_578.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00b1a632;
                          }
                          (((Vec3f *)((long)local_578.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_578.hit;
                          (((Vec3f *)((long)local_578.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_578.hit + 4);
                          (((Vec3f *)((long)local_578.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_578.hit + 8);
                          *(float *)((long)local_578.ray + 0x3c) = *(float *)(local_578.hit + 0xc);
                          *(float *)((long)local_578.ray + 0x40) = *(float *)(local_578.hit + 0x10);
                          *(float *)((long)local_578.ray + 0x44) = *(float *)(local_578.hit + 0x14);
                          *(float *)((long)local_578.ray + 0x48) = *(float *)(local_578.hit + 0x18);
                          *(float *)((long)local_578.ray + 0x4c) = *(float *)(local_578.hit + 0x1c);
                          pRVar70 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_578.hit + 0x20);
                          *(float *)((long)local_578.ray + 0x50) = *(float *)(local_578.hit + 0x20);
                          pRVar68 = (RayHit *)local_578.ray;
                        }
                        else {
                          (*pGVar19->intersectionFilterN)(&local_578);
                          if ((((RayK<1> *)local_578.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00b1a598;
LAB_00b1a632:
                          (ray->super_RayK<1>).tfar = fVar84;
                          pRVar68 = (RayHit *)local_578.valid;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar76 = lVar76 + -1;
              } while (lVar76 != 0);
              uVar64 = SUB84(pRVar70,0);
              fVar129 = (ray->super_RayK<1>).tfar;
              local_398._0_4_ = -(uint)(local_468 <= fVar129) & local_398._0_4_;
              local_398._4_4_ = -(uint)(fStack_464 <= fVar129) & local_398._4_4_;
              local_398._8_4_ = -(uint)(fStack_460 <= fVar129) & local_398._8_4_;
              local_398._12_4_ = -(uint)(fStack_45c <= fVar129) & local_398._12_4_;
              uVar69 = (undefined4)((ulong)pRVar68 >> 0x20);
              iVar63 = movmskps((int)pRVar68,local_398);
              fVar155 = (float)local_458._0_4_;
              fVar156 = (float)local_458._4_4_;
              fVar157 = fStack_450;
              fVar166 = fStack_44c;
            } while (iVar63 != 0);
            iVar63 = 0;
            fVar155 = (float)local_298._0_4_;
            fVar156 = (float)local_298._4_4_;
            fVar157 = fStack_290;
            fVar166 = fStack_28c;
          }
          auVar197._0_4_ =
               local_508._0_4_ & local_328._0_4_ &
               -(uint)(local_4f8 + (float)local_138._0_4_ <= fVar129);
          auVar197._4_4_ =
               local_508._4_4_ & local_328._4_4_ &
               -(uint)(fStack_4f4 + (float)local_138._4_4_ <= fVar129);
          auVar197._8_4_ =
               (uint)fStack_500 & (uint)fStack_320 & -(uint)(fStack_4f0 + fStack_130 <= fVar129);
          auVar197._12_4_ =
               (uint)fStack_4fc & (uint)fStack_31c & -(uint)(fStack_4ec + fStack_12c <= fVar129);
          auVar124._0_4_ =
               auVar151._0_4_ & local_518._0_4_ & -(uint)(local_4f8 + fVar155 <= fVar129);
          auVar124._4_4_ =
               auVar151._4_4_ & local_518._4_4_ & -(uint)(fStack_4f4 + fVar156 <= fVar129);
          auVar124._8_4_ =
               auVar151._8_4_ & (uint)fStack_510 & -(uint)(fStack_4f0 + fVar157 <= fVar129);
          auVar124._12_4_ =
               auVar151._12_4_ & (uint)fStack_50c & -(uint)(fStack_4ec + fVar166 <= fVar129);
          iVar63 = movmskps(iVar63,auVar124 | auVar197);
          if (iVar63 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar73 * 0x30) = auVar124 | auVar197;
            auStack_e8[uVar73 * 0xc] =
                 ~auVar197._0_4_ & (uint)fVar155 | local_138._0_4_ & auVar197._0_4_;
            auStack_e8[uVar73 * 0xc + 1] =
                 ~auVar197._4_4_ & (uint)fVar156 | local_138._4_4_ & auVar197._4_4_;
            auStack_e8[uVar73 * 0xc + 2] =
                 ~auVar197._8_4_ & (uint)fVar157 | (uint)fStack_130 & auVar197._8_4_;
            auStack_e8[uVar73 * 0xc + 3] =
                 ~auVar197._12_4_ & (uint)fVar166 | (uint)fStack_12c & auVar197._12_4_;
            (&uStack_d8)[uVar73 * 6] = CONCAT44(fStack_1e4,local_1e8);
            aiStack_d0[uVar73 * 0xc] = (int)fVar167 + 1;
            iVar72 = iVar72 + 1;
          }
        }
      }
    }
    fVar166 = fStack_35c;
    fVar157 = fStack_360;
    fVar156 = fStack_364;
    fVar155 = local_368;
    fVar129 = fStack_36c;
    fVar128 = fStack_370;
    fVar127 = fStack_374;
    fVar84 = local_378;
    fVar167 = (ray->super_RayK<1>).tfar;
    if (iVar72 == 0) break;
    uVar81 = -iVar72;
    pauVar66 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar72 - 1) * 0x30);
    uVar79 = uVar81;
    while( true ) {
      local_578.valid._0_4_ =
           -(uint)(local_4f8 + *(float *)pauVar66[1] <= fVar167) & *(uint *)*pauVar66;
      local_578.valid._4_4_ =
           -(uint)(fStack_4f4 + *(float *)(pauVar66[1] + 4) <= fVar167) & *(uint *)(*pauVar66 + 4);
      local_578.geometryUserPtr._0_4_ =
           -(uint)(fStack_4f0 + *(float *)(pauVar66[1] + 8) <= fVar167) & *(uint *)(*pauVar66 + 8);
      local_578.geometryUserPtr._4_4_ =
           -(uint)(fStack_4ec + *(float *)(pauVar66[1] + 0xc) <= fVar167) &
           *(uint *)(*pauVar66 + 0xc);
      iVar63 = movmskps(uVar79,(undefined1  [16])local_578._0_16_);
      if (iVar63 != 0) break;
      pauVar66 = pauVar66 + -3;
      uVar81 = uVar81 + 1;
      uVar79 = 0;
      if (uVar81 == 0) {
        uVar64 = 0;
        goto LAB_00b1a6f4;
      }
    }
    auVar163._0_4_ = (uint)*(float *)pauVar66[1] & (uint)local_578.valid;
    auVar163._4_4_ = (uint)*(float *)(pauVar66[1] + 4) & local_578.valid._4_4_;
    auVar163._8_4_ = (uint)*(float *)(pauVar66[1] + 8) & (uint)local_578.geometryUserPtr;
    auVar163._12_4_ = (uint)*(float *)(pauVar66[1] + 0xc) & local_578.geometryUserPtr._4_4_;
    auVar181._0_8_ = CONCAT44(~local_578.valid._4_4_,~(uint)local_578.valid) & 0x7f8000007f800000;
    auVar181._8_4_ = ~(uint)local_578.geometryUserPtr & 0x7f800000;
    auVar181._12_4_ = ~local_578.geometryUserPtr._4_4_ & 0x7f800000;
    auVar181 = auVar181 | auVar163;
    auVar164._4_4_ = auVar181._0_4_;
    auVar164._0_4_ = auVar181._4_4_;
    auVar164._8_4_ = auVar181._12_4_;
    auVar164._12_4_ = auVar181._8_4_;
    auVar85 = minps(auVar164,auVar181);
    auVar118._0_8_ = auVar85._8_8_;
    auVar118._8_4_ = auVar85._0_4_;
    auVar118._12_4_ = auVar85._4_4_;
    auVar85 = minps(auVar118,auVar85);
    auVar119._0_8_ =
         CONCAT44(-(uint)(auVar85._4_4_ == auVar181._4_4_) & local_578.valid._4_4_,
                  -(uint)(auVar85._0_4_ == auVar181._0_4_) & (uint)local_578.valid);
    auVar119._8_4_ = -(uint)(auVar85._8_4_ == auVar181._8_4_) & (uint)local_578.geometryUserPtr;
    auVar119._12_4_ = -(uint)(auVar85._12_4_ == auVar181._12_4_) & local_578.geometryUserPtr._4_4_;
    iVar63 = movmskps(iVar63,auVar119);
    auVar150 = (undefined1  [16])local_578._0_16_;
    if (iVar63 != 0) {
      auVar150._8_4_ = auVar119._8_4_;
      auVar150._0_8_ = auVar119._0_8_;
      auVar150._12_4_ = auVar119._12_4_;
    }
    uVar17 = *(undefined8 *)pauVar66[2];
    fVar167 = *(float *)(pauVar66[2] + 8);
    uVar79 = movmskps(iVar63,auVar150);
    pRVar70 = (RTCIntersectArguments *)0x0;
    if (uVar79 != 0) {
      for (; (uVar79 >> (long)pRVar70 & 1) == 0;
          pRVar70 = (RTCIntersectArguments *)((long)&pRVar70->flags + 1)) {
      }
    }
    *(undefined4 *)((long)&local_578.valid + (long)pRVar70 * 4) = 0;
    *pauVar66 = (undefined1  [16])local_578._0_16_;
    iVar63 = movmskps((int)pauVar66,(undefined1  [16])local_578._0_16_);
    lVar67 = CONCAT44((int)((ulong)pauVar66 >> 0x20),iVar63);
    uVar79 = ~uVar81;
    if (iVar63 != 0) {
      uVar79 = -uVar81;
    }
    uVar73 = (ulong)uVar79;
    fVar199 = (float)uVar17;
    fVar200 = (float)((ulong)uVar17 >> 0x20) - fVar199;
    local_4b8 = CONCAT44(fVar200 * 0.33333334 + fVar199,fVar200 * 0.0 + fVar199);
    fStack_4b0 = fVar200 * 0.6666667 + fVar199;
    fStack_4ac = fVar200 * 1.0 + fVar199;
    local_1e8 = *(float *)((long)&local_4b8 + (long)pRVar70 * 4);
    fStack_1e4 = *(float *)((long)&local_4b8 + (long)pRVar70 * 4 + 4);
  } while( true );
LAB_00b1a6f4:
  auVar154._4_4_ = -(uint)(fStack_274 <= fVar167);
  auVar154._0_4_ = -(uint)(local_278 <= fVar167);
  auVar154._8_4_ = -(uint)(fStack_270 <= fVar167);
  auVar154._12_4_ = -(uint)(fStack_26c <= fVar167);
  uVar77 = movmskps(uVar64,auVar154);
  uVar77 = (uint)local_2e0 - 1 & (uint)local_2e0 & uVar77;
  if (uVar77 == 0) {
    return;
  }
  goto LAB_00b18091;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }